

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generatorprofile.cpp
# Opt level: O0

void __thiscall
GeneratorProfile_defaultMiscellaneousValues_Test::TestBody
          (GeneratorProfile_defaultMiscellaneousValues_Test *this)

{
  bool bVar1;
  char *pcVar2;
  element_type *peVar3;
  AssertHelper local_1670 [8];
  Message local_1668 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1660;
  undefined1 local_1640 [8];
  AssertionResult gtest_ar_88;
  Message local_1628 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1620;
  undefined1 local_1600 [8];
  AssertionResult gtest_ar_87;
  Message local_15e8 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_15e0;
  undefined1 local_15c0 [8];
  AssertionResult gtest_ar_86;
  Message local_15a8 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_15a0;
  undefined1 local_1580 [8];
  AssertionResult gtest_ar_85;
  Message local_1568 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1560;
  undefined1 local_1540 [8];
  AssertionResult gtest_ar_84;
  Message local_1528 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1520;
  undefined1 local_1500 [8];
  AssertionResult gtest_ar_83;
  Message local_14e8 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_14e0;
  undefined1 local_14c0 [8];
  AssertionResult gtest_ar_82;
  Message local_14a8 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_14a0;
  undefined1 local_1480 [8];
  AssertionResult gtest_ar_81;
  Message local_1468 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1460;
  undefined1 local_1440 [8];
  AssertionResult gtest_ar_80;
  Message local_1428 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1420;
  undefined1 local_1400 [8];
  AssertionResult gtest_ar_79;
  Message local_13e8 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_13e0;
  undefined1 local_13c0 [8];
  AssertionResult gtest_ar_78;
  Message local_13a8 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_13a0;
  undefined1 local_1380 [8];
  AssertionResult gtest_ar_77;
  Message local_1368 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1360;
  undefined1 local_1340 [8];
  AssertionResult gtest_ar_76;
  Message local_1328 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1320;
  undefined1 local_1300 [8];
  AssertionResult gtest_ar_75;
  Message local_12e8 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_12e0;
  undefined1 local_12c0 [8];
  AssertionResult gtest_ar_74;
  Message local_12a8 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_12a0;
  undefined1 local_1280 [8];
  AssertionResult gtest_ar_73;
  Message local_1268 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1260;
  undefined1 local_1240 [8];
  AssertionResult gtest_ar_72;
  Message local_1228 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1220;
  undefined1 local_1200 [8];
  AssertionResult gtest_ar_71;
  Message local_11e8 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_11e0;
  undefined1 local_11c0 [8];
  AssertionResult gtest_ar_70;
  Message local_11a8 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_11a0;
  undefined1 local_1180 [8];
  AssertionResult gtest_ar_69;
  Message local_1168 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1160;
  undefined1 local_1140 [8];
  AssertionResult gtest_ar_68;
  Message local_1128 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1120;
  undefined1 local_1100 [8];
  AssertionResult gtest_ar_67;
  Message local_10e8 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_10e0;
  undefined1 local_10c0 [8];
  AssertionResult gtest_ar_66;
  Message local_10a8 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_10a0;
  undefined1 local_1080 [8];
  AssertionResult gtest_ar_65;
  Message local_1068 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1060;
  undefined1 local_1040 [8];
  AssertionResult gtest_ar_64;
  Message local_1028 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1020;
  undefined1 local_1000 [8];
  AssertionResult gtest_ar_63;
  Message local_fe8 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_fe0;
  undefined1 local_fc0 [8];
  AssertionResult gtest_ar_62;
  Message local_fa8 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_fa0;
  undefined1 local_f80 [8];
  AssertionResult gtest_ar_61;
  Message local_f68 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f60;
  undefined1 local_f40 [8];
  AssertionResult gtest_ar_60;
  Message local_f28 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f20;
  undefined1 local_f00 [8];
  AssertionResult gtest_ar_59;
  Message local_ee8 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_ee0;
  undefined1 local_ec0 [8];
  AssertionResult gtest_ar_58;
  Message local_ea8 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_ea0;
  undefined1 local_e80 [8];
  AssertionResult gtest_ar_57;
  Message local_e68 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_e60;
  undefined1 local_e40 [8];
  AssertionResult gtest_ar_56;
  Message local_e28 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_e20;
  undefined1 local_e00 [8];
  AssertionResult gtest_ar_55;
  Message local_de8 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_de0;
  undefined1 local_dc0 [8];
  AssertionResult gtest_ar_54;
  Message local_da8 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_da0;
  undefined1 local_d80 [8];
  AssertionResult gtest_ar_53;
  Message local_d68 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d60;
  undefined1 local_d40 [8];
  AssertionResult gtest_ar_52;
  Message local_d28 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d20;
  undefined1 local_d00 [8];
  AssertionResult gtest_ar_51;
  Message local_ce8 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_ce0;
  undefined1 local_cc0 [8];
  AssertionResult gtest_ar_50;
  Message local_ca8 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_ca0;
  undefined1 local_c80 [8];
  AssertionResult gtest_ar_49;
  Message local_c68 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c60;
  undefined1 local_c40 [8];
  AssertionResult gtest_ar_48;
  Message local_c28 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c20;
  undefined1 local_c00 [8];
  AssertionResult gtest_ar_47;
  Message local_be8 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_be0;
  undefined1 local_bc0 [8];
  AssertionResult gtest_ar_46;
  Message local_ba8 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_ba0;
  undefined1 local_b80 [8];
  AssertionResult gtest_ar_45;
  Message local_b68 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b60;
  undefined1 local_b40 [8];
  AssertionResult gtest_ar_44;
  Message local_b28 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b20;
  undefined1 local_b00 [8];
  AssertionResult gtest_ar_43;
  Message local_ae8 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_ae0;
  undefined1 local_ac0 [8];
  AssertionResult gtest_ar_42;
  Message local_aa8 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_aa0;
  undefined1 local_a80 [8];
  AssertionResult gtest_ar_41;
  Message local_a68 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a60;
  undefined1 local_a40 [8];
  AssertionResult gtest_ar_40;
  Message local_a28 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a20;
  undefined1 local_a00 [8];
  AssertionResult gtest_ar_39;
  Message local_9e8 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_9e0;
  undefined1 local_9c0 [8];
  AssertionResult gtest_ar_38;
  Message local_9a8 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_9a0;
  undefined1 local_980 [8];
  AssertionResult gtest_ar_37;
  Message local_968 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_960;
  undefined1 local_940 [8];
  AssertionResult gtest_ar_36;
  Message local_928 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_920;
  undefined1 local_900 [8];
  AssertionResult gtest_ar_35;
  Message local_8e8 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_8e0;
  undefined1 local_8c0 [8];
  AssertionResult gtest_ar_34;
  Message local_8a8 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_8a0;
  undefined1 local_880 [8];
  AssertionResult gtest_ar_33;
  Message local_868 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_860;
  undefined1 local_840 [8];
  AssertionResult gtest_ar_32;
  Message local_828 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_820;
  undefined1 local_800 [8];
  AssertionResult gtest_ar_31;
  Message local_7e8 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_7e0;
  undefined1 local_7c0 [8];
  AssertionResult gtest_ar_30;
  Message local_7a8 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_7a0;
  undefined1 local_780 [8];
  AssertionResult gtest_ar_29;
  Message local_768 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_760;
  undefined1 local_740 [8];
  AssertionResult gtest_ar_28;
  Message local_728 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_720;
  undefined1 local_700 [8];
  AssertionResult gtest_ar_27;
  Message local_6e8 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_6e0;
  undefined1 local_6c0 [8];
  AssertionResult gtest_ar_26;
  Message local_6a8 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_6a0;
  undefined1 local_680 [8];
  AssertionResult gtest_ar_25;
  Message local_668 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_660;
  undefined1 local_640 [8];
  AssertionResult gtest_ar_24;
  Message local_628 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_620;
  undefined1 local_600 [8];
  AssertionResult gtest_ar_23;
  Message local_5e8 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_5e0;
  undefined1 local_5c0 [8];
  AssertionResult gtest_ar_22;
  Message local_5a8 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_5a0;
  undefined1 local_580 [8];
  AssertionResult gtest_ar_21;
  Message local_568 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_560;
  undefined1 local_540 [8];
  AssertionResult gtest_ar_20;
  Message local_528 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_520;
  undefined1 local_500 [8];
  AssertionResult gtest_ar_19;
  Message local_4e8 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_4e0;
  undefined1 local_4c0 [8];
  AssertionResult gtest_ar_18;
  Message local_4a8 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_4a0;
  undefined1 local_480 [8];
  AssertionResult gtest_ar_17;
  Message local_468 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_460;
  undefined1 local_440 [8];
  AssertionResult gtest_ar_16;
  Message local_428 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_420;
  undefined1 local_400 [8];
  AssertionResult gtest_ar_15;
  Message local_3e8 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3e0;
  undefined1 local_3c0 [8];
  AssertionResult gtest_ar_14;
  Message local_3a8 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3a0;
  undefined1 local_380 [8];
  AssertionResult gtest_ar_13;
  Message local_368 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_360;
  undefined1 local_340 [8];
  AssertionResult gtest_ar_12;
  Message local_328 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_320;
  undefined1 local_300 [8];
  AssertionResult gtest_ar_11;
  Message local_2e8 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2e0;
  undefined1 local_2c0 [8];
  AssertionResult gtest_ar_10;
  Message local_2a8 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2a0;
  undefined1 local_280 [8];
  AssertionResult gtest_ar_9;
  Message local_268 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_260;
  undefined1 local_240 [8];
  AssertionResult gtest_ar_8;
  Message local_228 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_220;
  undefined1 local_200 [8];
  AssertionResult gtest_ar_7;
  Message local_1e8 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1e0;
  undefined1 local_1c0 [8];
  AssertionResult gtest_ar_6;
  Message local_1a8 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1a0;
  undefined1 local_180 [8];
  AssertionResult gtest_ar_5;
  Message local_168 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_160;
  undefined1 local_140 [8];
  AssertionResult gtest_ar_4;
  Message local_128 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_120;
  undefined1 local_100 [8];
  AssertionResult gtest_ar_3;
  Message local_e8 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_e0;
  undefined1 local_c0 [8];
  AssertionResult gtest_ar_2;
  Message local_a8 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a0;
  undefined1 local_80 [8];
  AssertionResult gtest_ar_1;
  Message local_68 [24];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  undefined1 local_30 [8];
  AssertionResult gtest_ar;
  GeneratorProfilePtr generatorProfile;
  GeneratorProfile_defaultMiscellaneousValues_Test *this_local;
  
  libcellml::GeneratorProfile::create((Profile)&gtest_ar.message_);
  std::__shared_ptr_access<libcellml::GeneratorProfile,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
  operator->((__shared_ptr_access<libcellml::GeneratorProfile,_(__gnu_cxx::_Lock_policy)2,_false,_false>
              *)&gtest_ar.message_);
  libcellml::GeneratorProfile::commentString_abi_cxx11_();
  testing::internal::EqHelper<false>::Compare<char[14],std::__cxx11::string>
            ((EqHelper<false> *)local_30,"\"/* [CODE] */\\n\"","generatorProfile->commentString()",
             (char (*) [14])"/* [CODE] */\n",&local_50);
  std::__cxx11::string::~string((string *)&local_50);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_30);
  if (!bVar1) {
    testing::Message::Message(local_68);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_30);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_1.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/generator/generatorprofile.cpp"
               ,0x102,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_1.message_,local_68);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_1.message_);
    testing::Message::~Message(local_68);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_30);
  std::__shared_ptr_access<libcellml::GeneratorProfile,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
  operator->((__shared_ptr_access<libcellml::GeneratorProfile,_(__gnu_cxx::_Lock_policy)2,_false,_false>
              *)&gtest_ar.message_);
  libcellml::GeneratorProfile::originCommentString_abi_cxx11_();
  testing::internal::EqHelper<false>::Compare<char[98],std::__cxx11::string>
            ((EqHelper<false> *)local_80,
             "\"The content of this file was generated using [PROFILE_INFORMATION] libCellML [LIBCELLML_VERSION].\""
             ,"generatorProfile->originCommentString()",
             (char (*) [98])
             "The content of this file was generated using [PROFILE_INFORMATION] libCellML [LIBCELLML_VERSION]."
             ,&local_a0);
  std::__cxx11::string::~string((string *)&local_a0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_80);
  if (!bVar1) {
    testing::Message::Message(local_a8);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_80);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_2.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/generator/generatorprofile.cpp"
               ,0x103,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_2.message_,local_a8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_2.message_);
    testing::Message::~Message(local_a8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_80);
  std::__shared_ptr_access<libcellml::GeneratorProfile,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
  operator->((__shared_ptr_access<libcellml::GeneratorProfile,_(__gnu_cxx::_Lock_policy)2,_false,_false>
              *)&gtest_ar.message_);
  libcellml::GeneratorProfile::interfaceFileNameString_abi_cxx11_();
  testing::internal::EqHelper<false>::Compare<char[8],std::__cxx11::string>
            ((EqHelper<false> *)local_c0,"\"model.h\"","generatorProfile->interfaceFileNameString()"
             ,(char (*) [8])0x18c9fc,&local_e0);
  std::__cxx11::string::~string((string *)&local_e0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_c0);
  if (!bVar1) {
    testing::Message::Message(local_e8);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_c0);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_3.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/generator/generatorprofile.cpp"
               ,0x105,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_3.message_,local_e8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_3.message_);
    testing::Message::~Message(local_e8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_c0);
  std::__shared_ptr_access<libcellml::GeneratorProfile,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
  operator->((__shared_ptr_access<libcellml::GeneratorProfile,_(__gnu_cxx::_Lock_policy)2,_false,_false>
              *)&gtest_ar.message_);
  libcellml::GeneratorProfile::interfaceHeaderString_abi_cxx11_();
  testing::internal::EqHelper<false>::Compare<char[35],std::__cxx11::string>
            ((EqHelper<false> *)local_100,"\"#pragma once\\n\" \"\\n\" \"#include <stddef.h>\\n\"",
             "generatorProfile->interfaceHeaderString()",
             (char (*) [35])"#pragma once\n\n#include <stddef.h>\n",&local_120);
  std::__cxx11::string::~string((string *)&local_120);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_100);
  if (!bVar1) {
    testing::Message::Message(local_128);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_100);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_4.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/generator/generatorprofile.cpp"
               ,0x10a,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_4.message_,local_128);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_4.message_);
    testing::Message::~Message(local_128);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_100);
  std::__shared_ptr_access<libcellml::GeneratorProfile,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
  operator->((__shared_ptr_access<libcellml::GeneratorProfile,_(__gnu_cxx::_Lock_policy)2,_false,_false>
              *)&gtest_ar.message_);
  libcellml::GeneratorProfile::implementationHeaderString_abi_cxx11_();
  testing::internal::EqHelper<false>::Compare<char[73],std::__cxx11::string>
            ((EqHelper<false> *)local_140,
             "\"#include \\\"[INTERFACE_FILE_NAME]\\\"\\n\" \"\\n\" \"#include <math.h>\\n\" \"#include <stdlib.h>\\n\""
             ,"generatorProfile->implementationHeaderString()",
             (char (*) [73])
             "#include \"[INTERFACE_FILE_NAME]\"\n\n#include <math.h>\n#include <stdlib.h>\n",
             &local_160);
  std::__cxx11::string::~string((string *)&local_160);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_140);
  if (!bVar1) {
    testing::Message::Message(local_168);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_140);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_5.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/generator/generatorprofile.cpp"
               ,0x10f,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_5.message_,local_168);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_5.message_);
    testing::Message::~Message(local_168);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_140);
  std::__shared_ptr_access<libcellml::GeneratorProfile,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
  operator->((__shared_ptr_access<libcellml::GeneratorProfile,_(__gnu_cxx::_Lock_policy)2,_false,_false>
              *)&gtest_ar.message_);
  libcellml::GeneratorProfile::interfaceVersionString_abi_cxx11_();
  testing::internal::EqHelper<false>::Compare<char[30],std::__cxx11::string>
            ((EqHelper<false> *)local_180,"\"extern const char VERSION[];\\n\"",
             "generatorProfile->interfaceVersionString()",
             (char (*) [30])"extern const char VERSION[];\n",&local_1a0);
  std::__cxx11::string::~string((string *)&local_1a0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_180);
  if (!bVar1) {
    testing::Message::Message(local_1a8);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_180);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_6.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/generator/generatorprofile.cpp"
               ,0x111,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_6.message_,local_1a8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_6.message_);
    testing::Message::~Message(local_1a8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_180);
  std::__shared_ptr_access<libcellml::GeneratorProfile,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
  operator->((__shared_ptr_access<libcellml::GeneratorProfile,_(__gnu_cxx::_Lock_policy)2,_false,_false>
              *)&gtest_ar.message_);
  libcellml::GeneratorProfile::implementationVersionString_abi_cxx11_();
  testing::internal::EqHelper<false>::Compare<char[33],std::__cxx11::string>
            ((EqHelper<false> *)local_1c0,"\"const char VERSION[] = \\\"0.5.0\\\";\\n\"",
             "generatorProfile->implementationVersionString()",
             (char (*) [33])"const char VERSION[] = \"0.5.0\";\n",&local_1e0);
  std::__cxx11::string::~string((string *)&local_1e0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1c0);
  if (!bVar1) {
    testing::Message::Message(local_1e8);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_1c0);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_7.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/generator/generatorprofile.cpp"
               ,0x112,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_7.message_,local_1e8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_7.message_);
    testing::Message::~Message(local_1e8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_1c0);
  std::__shared_ptr_access<libcellml::GeneratorProfile,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
  operator->((__shared_ptr_access<libcellml::GeneratorProfile,_(__gnu_cxx::_Lock_policy)2,_false,_false>
              *)&gtest_ar.message_);
  libcellml::GeneratorProfile::interfaceLibcellmlVersionString_abi_cxx11_();
  testing::internal::EqHelper<false>::Compare<char[40],std::__cxx11::string>
            ((EqHelper<false> *)local_200,"\"extern const char LIBCELLML_VERSION[];\\n\"",
             "generatorProfile->interfaceLibcellmlVersionString()",
             (char (*) [40])"extern const char LIBCELLML_VERSION[];\n",&local_220);
  std::__cxx11::string::~string((string *)&local_220);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_200);
  if (!bVar1) {
    testing::Message::Message(local_228);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_200);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_8.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/generator/generatorprofile.cpp"
               ,0x114,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_8.message_,local_228);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_8.message_);
    testing::Message::~Message(local_228);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_200);
  std::__shared_ptr_access<libcellml::GeneratorProfile,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
  operator->((__shared_ptr_access<libcellml::GeneratorProfile,_(__gnu_cxx::_Lock_policy)2,_false,_false>
              *)&gtest_ar.message_);
  libcellml::GeneratorProfile::implementationLibcellmlVersionString_abi_cxx11_();
  testing::internal::EqHelper<false>::Compare<char[57],std::__cxx11::string>
            ((EqHelper<false> *)local_240,
             "\"const char LIBCELLML_VERSION[] = \\\"[LIBCELLML_VERSION]\\\";\\n\"",
             "generatorProfile->implementationLibcellmlVersionString()",
             (char (*) [57])"const char LIBCELLML_VERSION[] = \"[LIBCELLML_VERSION]\";\n",&local_260
            );
  std::__cxx11::string::~string((string *)&local_260);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_240);
  if (!bVar1) {
    testing::Message::Message(local_268);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_240);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_9.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/generator/generatorprofile.cpp"
               ,0x115,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_9.message_,local_268);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_9.message_);
    testing::Message::~Message(local_268);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_240);
  std::__shared_ptr_access<libcellml::GeneratorProfile,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
  operator->((__shared_ptr_access<libcellml::GeneratorProfile,_(__gnu_cxx::_Lock_policy)2,_false,_false>
              *)&gtest_ar.message_);
  libcellml::GeneratorProfile::interfaceStateCountString_abi_cxx11_();
  testing::internal::EqHelper<false>::Compare<char[34],std::__cxx11::string>
            ((EqHelper<false> *)local_280,"\"extern const size_t STATE_COUNT;\\n\"",
             "generatorProfile->interfaceStateCountString()",
             (char (*) [34])"extern const size_t STATE_COUNT;\n",&local_2a0);
  std::__cxx11::string::~string((string *)&local_2a0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_280);
  if (!bVar1) {
    testing::Message::Message(local_2a8);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_280);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_10.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/generator/generatorprofile.cpp"
               ,0x117,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_10.message_,local_2a8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_10.message_);
    testing::Message::~Message(local_2a8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_280);
  std::__shared_ptr_access<libcellml::GeneratorProfile,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
  operator->((__shared_ptr_access<libcellml::GeneratorProfile,_(__gnu_cxx::_Lock_policy)2,_false,_false>
              *)&gtest_ar.message_);
  libcellml::GeneratorProfile::implementationStateCountString_abi_cxx11_();
  testing::internal::EqHelper<false>::Compare<char[43],std::__cxx11::string>
            ((EqHelper<false> *)local_2c0,"\"const size_t STATE_COUNT = [STATE_COUNT];\\n\"",
             "generatorProfile->implementationStateCountString()",
             (char (*) [43])"const size_t STATE_COUNT = [STATE_COUNT];\n",&local_2e0);
  std::__cxx11::string::~string((string *)&local_2e0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_2c0);
  if (!bVar1) {
    testing::Message::Message(local_2e8);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_2c0);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_11.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/generator/generatorprofile.cpp"
               ,0x118,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_11.message_,local_2e8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_11.message_);
    testing::Message::~Message(local_2e8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_2c0);
  std::__shared_ptr_access<libcellml::GeneratorProfile,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
  operator->((__shared_ptr_access<libcellml::GeneratorProfile,_(__gnu_cxx::_Lock_policy)2,_false,_false>
              *)&gtest_ar.message_);
  libcellml::GeneratorProfile::interfaceVariableCountString_abi_cxx11_();
  testing::internal::EqHelper<false>::Compare<char[37],std::__cxx11::string>
            ((EqHelper<false> *)local_300,"\"extern const size_t VARIABLE_COUNT;\\n\"",
             "generatorProfile->interfaceVariableCountString()",
             (char (*) [37])"extern const size_t VARIABLE_COUNT;\n",&local_320);
  std::__cxx11::string::~string((string *)&local_320);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_300);
  if (!bVar1) {
    testing::Message::Message(local_328);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_300);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_12.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/generator/generatorprofile.cpp"
               ,0x11a,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_12.message_,local_328);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_12.message_);
    testing::Message::~Message(local_328);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_300);
  std::__shared_ptr_access<libcellml::GeneratorProfile,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
  operator->((__shared_ptr_access<libcellml::GeneratorProfile,_(__gnu_cxx::_Lock_policy)2,_false,_false>
              *)&gtest_ar.message_);
  libcellml::GeneratorProfile::implementationVariableCountString_abi_cxx11_();
  testing::internal::EqHelper<false>::Compare<char[49],std::__cxx11::string>
            ((EqHelper<false> *)local_340,"\"const size_t VARIABLE_COUNT = [VARIABLE_COUNT];\\n\"",
             "generatorProfile->implementationVariableCountString()",
             (char (*) [49])"const size_t VARIABLE_COUNT = [VARIABLE_COUNT];\n",&local_360);
  std::__cxx11::string::~string((string *)&local_360);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_340);
  if (!bVar1) {
    testing::Message::Message(local_368);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_340);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_13.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/generator/generatorprofile.cpp"
               ,0x11b,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_13.message_,local_368);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_13.message_);
    testing::Message::~Message(local_368);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_340);
  peVar3 = std::
           __shared_ptr_access<libcellml::GeneratorProfile,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<libcellml::GeneratorProfile,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)&gtest_ar.message_);
  libcellml::GeneratorProfile::variableTypeObjectString_abi_cxx11_
            (SUB81(&local_3a0,0),SUB81(peVar3,0));
  testing::internal::EqHelper<false>::Compare<char[83],std::__cxx11::string>
            ((EqHelper<false> *)local_380,
             "\"typedef enum {\\n\" \"    CONSTANT,\\n\" \"    COMPUTED_CONSTANT,\\n\" \"    ALGEBRAIC\\n\" \"} VariableType;\\n\""
             ,"generatorProfile->variableTypeObjectString(false, false)",
             (char (*) [83])
             "typedef enum {\n    CONSTANT,\n    COMPUTED_CONSTANT,\n    ALGEBRAIC\n} VariableType;\n"
             ,&local_3a0);
  std::__cxx11::string::~string((string *)&local_3a0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_380);
  if (!bVar1) {
    testing::Message::Message(local_3a8);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_380);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_14.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/generator/generatorprofile.cpp"
               ,0x122,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_14.message_,local_3a8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_14.message_);
    testing::Message::~Message(local_3a8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_380);
  peVar3 = std::
           __shared_ptr_access<libcellml::GeneratorProfile,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<libcellml::GeneratorProfile,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)&gtest_ar.message_);
  libcellml::GeneratorProfile::variableTypeObjectString_abi_cxx11_
            (SUB81(&local_3e0,0),SUB81(peVar3,0));
  testing::internal::EqHelper<false>::Compare<char[97],std::__cxx11::string>
            ((EqHelper<false> *)local_3c0,
             "\"typedef enum {\\n\" \"    CONSTANT,\\n\" \"    COMPUTED_CONSTANT,\\n\" \"    ALGEBRAIC,\\n\" \"    EXTERNAL\\n\" \"} VariableType;\\n\""
             ,"generatorProfile->variableTypeObjectString(false, true)",
             (char (*) [97])
             "typedef enum {\n    CONSTANT,\n    COMPUTED_CONSTANT,\n    ALGEBRAIC,\n    EXTERNAL\n} VariableType;\n"
             ,&local_3e0);
  std::__cxx11::string::~string((string *)&local_3e0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_3c0);
  if (!bVar1) {
    testing::Message::Message(local_3e8);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_3c0);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_15.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/generator/generatorprofile.cpp"
               ,0x129,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_15.message_,local_3e8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_15.message_);
    testing::Message::~Message(local_3e8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_3c0);
  peVar3 = std::
           __shared_ptr_access<libcellml::GeneratorProfile,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<libcellml::GeneratorProfile,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)&gtest_ar.message_);
  libcellml::GeneratorProfile::variableTypeObjectString_abi_cxx11_
            (SUB81(&local_420,0),SUB81(peVar3,0));
  testing::internal::EqHelper<false>::Compare<char[123],std::__cxx11::string>
            ((EqHelper<false> *)local_400,
             "\"typedef enum {\\n\" \"    VARIABLE_OF_INTEGRATION,\\n\" \"    STATE,\\n\" \"    CONSTANT,\\n\" \"    COMPUTED_CONSTANT,\\n\" \"    ALGEBRAIC\\n\" \"} VariableType;\\n\""
             ,"generatorProfile->variableTypeObjectString(true, false)",
             (char (*) [123])
             "typedef enum {\n    VARIABLE_OF_INTEGRATION,\n    STATE,\n    CONSTANT,\n    COMPUTED_CONSTANT,\n    ALGEBRAIC\n} VariableType;\n"
             ,&local_420);
  std::__cxx11::string::~string((string *)&local_420);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_400);
  if (!bVar1) {
    testing::Message::Message(local_428);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_400);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_16.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/generator/generatorprofile.cpp"
               ,0x131,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_16.message_,local_428);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_16.message_);
    testing::Message::~Message(local_428);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_400);
  peVar3 = std::
           __shared_ptr_access<libcellml::GeneratorProfile,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<libcellml::GeneratorProfile,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)&gtest_ar.message_);
  libcellml::GeneratorProfile::variableTypeObjectString_abi_cxx11_
            (SUB81(&local_460,0),SUB81(peVar3,0));
  testing::internal::EqHelper<false>::Compare<char[137],std::__cxx11::string>
            ((EqHelper<false> *)local_440,
             "\"typedef enum {\\n\" \"    VARIABLE_OF_INTEGRATION,\\n\" \"    STATE,\\n\" \"    CONSTANT,\\n\" \"    COMPUTED_CONSTANT,\\n\" \"    ALGEBRAIC,\\n\" \"    EXTERNAL\\n\" \"} VariableType;\\n\""
             ,"generatorProfile->variableTypeObjectString(true, true)",
             (char (*) [137])
             "typedef enum {\n    VARIABLE_OF_INTEGRATION,\n    STATE,\n    CONSTANT,\n    COMPUTED_CONSTANT,\n    ALGEBRAIC,\n    EXTERNAL\n} VariableType;\n"
             ,&local_460);
  std::__cxx11::string::~string((string *)&local_460);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_440);
  if (!bVar1) {
    testing::Message::Message(local_468);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_440);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_17.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/generator/generatorprofile.cpp"
               ,0x13a,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_17.message_,local_468);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_17.message_);
    testing::Message::~Message(local_468);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_440);
  std::__shared_ptr_access<libcellml::GeneratorProfile,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
  operator->((__shared_ptr_access<libcellml::GeneratorProfile,_(__gnu_cxx::_Lock_policy)2,_false,_false>
              *)&gtest_ar.message_);
  libcellml::GeneratorProfile::variableOfIntegrationVariableTypeString_abi_cxx11_();
  testing::internal::EqHelper<false>::Compare<char[24],std::__cxx11::string>
            ((EqHelper<false> *)local_480,"\"VARIABLE_OF_INTEGRATION\"",
             "generatorProfile->variableOfIntegrationVariableTypeString()",
             (char (*) [24])"VARIABLE_OF_INTEGRATION",&local_4a0);
  std::__cxx11::string::~string((string *)&local_4a0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_480);
  if (!bVar1) {
    testing::Message::Message(local_4a8);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_480);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_18.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/generator/generatorprofile.cpp"
               ,0x13c,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_18.message_,local_4a8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_18.message_);
    testing::Message::~Message(local_4a8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_480);
  std::__shared_ptr_access<libcellml::GeneratorProfile,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
  operator->((__shared_ptr_access<libcellml::GeneratorProfile,_(__gnu_cxx::_Lock_policy)2,_false,_false>
              *)&gtest_ar.message_);
  libcellml::GeneratorProfile::stateVariableTypeString_abi_cxx11_();
  testing::internal::EqHelper<false>::Compare<char[6],std::__cxx11::string>
            ((EqHelper<false> *)local_4c0,"\"STATE\"","generatorProfile->stateVariableTypeString()",
             (char (*) [6])"STATE",&local_4e0);
  std::__cxx11::string::~string((string *)&local_4e0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_4c0);
  if (!bVar1) {
    testing::Message::Message(local_4e8);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_4c0);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_19.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/generator/generatorprofile.cpp"
               ,0x13d,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_19.message_,local_4e8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_19.message_);
    testing::Message::~Message(local_4e8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_4c0);
  std::__shared_ptr_access<libcellml::GeneratorProfile,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
  operator->((__shared_ptr_access<libcellml::GeneratorProfile,_(__gnu_cxx::_Lock_policy)2,_false,_false>
              *)&gtest_ar.message_);
  libcellml::GeneratorProfile::constantVariableTypeString_abi_cxx11_();
  testing::internal::EqHelper<false>::Compare<char[9],std::__cxx11::string>
            ((EqHelper<false> *)local_500,"\"CONSTANT\"",
             "generatorProfile->constantVariableTypeString()",(char (*) [9])0x193949,&local_520);
  std::__cxx11::string::~string((string *)&local_520);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_500);
  if (!bVar1) {
    testing::Message::Message(local_528);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_500);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_20.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/generator/generatorprofile.cpp"
               ,0x13e,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_20.message_,local_528);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_20.message_);
    testing::Message::~Message(local_528);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_500);
  std::__shared_ptr_access<libcellml::GeneratorProfile,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
  operator->((__shared_ptr_access<libcellml::GeneratorProfile,_(__gnu_cxx::_Lock_policy)2,_false,_false>
              *)&gtest_ar.message_);
  libcellml::GeneratorProfile::computedConstantVariableTypeString_abi_cxx11_();
  testing::internal::EqHelper<false>::Compare<char[18],std::__cxx11::string>
            ((EqHelper<false> *)local_540,"\"COMPUTED_CONSTANT\"",
             "generatorProfile->computedConstantVariableTypeString()",
             (char (*) [18])"COMPUTED_CONSTANT",&local_560);
  std::__cxx11::string::~string((string *)&local_560);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_540);
  if (!bVar1) {
    testing::Message::Message(local_568);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_540);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_21.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/generator/generatorprofile.cpp"
               ,0x13f,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_21.message_,local_568);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_21.message_);
    testing::Message::~Message(local_568);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_540);
  std::__shared_ptr_access<libcellml::GeneratorProfile,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
  operator->((__shared_ptr_access<libcellml::GeneratorProfile,_(__gnu_cxx::_Lock_policy)2,_false,_false>
              *)&gtest_ar.message_);
  libcellml::GeneratorProfile::algebraicVariableTypeString_abi_cxx11_();
  testing::internal::EqHelper<false>::Compare<char[10],std::__cxx11::string>
            ((EqHelper<false> *)local_580,"\"ALGEBRAIC\"",
             "generatorProfile->algebraicVariableTypeString()",(char (*) [10])"ALGEBRAIC",&local_5a0
            );
  std::__cxx11::string::~string((string *)&local_5a0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_580);
  if (!bVar1) {
    testing::Message::Message(local_5a8);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_580);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_22.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/generator/generatorprofile.cpp"
               ,0x140,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_22.message_,local_5a8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_22.message_);
    testing::Message::~Message(local_5a8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_580);
  std::__shared_ptr_access<libcellml::GeneratorProfile,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
  operator->((__shared_ptr_access<libcellml::GeneratorProfile,_(__gnu_cxx::_Lock_policy)2,_false,_false>
              *)&gtest_ar.message_);
  libcellml::GeneratorProfile::externalVariableTypeString_abi_cxx11_();
  testing::internal::EqHelper<false>::Compare<char[9],std::__cxx11::string>
            ((EqHelper<false> *)local_5c0,"\"EXTERNAL\"",
             "generatorProfile->externalVariableTypeString()",(char (*) [9])"EXTERNAL",&local_5e0);
  std::__cxx11::string::~string((string *)&local_5e0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_5c0);
  if (!bVar1) {
    testing::Message::Message(local_5e8);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_5c0);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_23.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/generator/generatorprofile.cpp"
               ,0x141,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_23.message_,local_5e8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_23.message_);
    testing::Message::~Message(local_5e8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_5c0);
  std::__shared_ptr_access<libcellml::GeneratorProfile,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
  operator->((__shared_ptr_access<libcellml::GeneratorProfile,_(__gnu_cxx::_Lock_policy)2,_false,_false>
              *)&gtest_ar.message_);
  libcellml::GeneratorProfile::variableInfoObjectString_abi_cxx11_();
  testing::internal::EqHelper<false>::Compare<char[153],std::__cxx11::string>
            ((EqHelper<false> *)local_600,
             "\"typedef struct {\\n\" \"    char name[[NAME_SIZE]];\\n\" \"    char units[[UNITS_SIZE]];\\n\" \"    char component[[COMPONENT_SIZE]];\\n\" \"    VariableType type;\\n\" \"} VariableInfo;\\n\""
             ,"generatorProfile->variableInfoObjectString()",
             (char (*) [153])
             "typedef struct {\n    char name[[NAME_SIZE]];\n    char units[[UNITS_SIZE]];\n    char component[[COMPONENT_SIZE]];\n    VariableType type;\n} VariableInfo;\n"
             ,&local_620);
  std::__cxx11::string::~string((string *)&local_620);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_600);
  if (!bVar1) {
    testing::Message::Message(local_628);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_600);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_24.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/generator/generatorprofile.cpp"
               ,0x149,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_24.message_,local_628);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_24.message_);
    testing::Message::~Message(local_628);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_600);
  std::__shared_ptr_access<libcellml::GeneratorProfile,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
  operator->((__shared_ptr_access<libcellml::GeneratorProfile,_(__gnu_cxx::_Lock_policy)2,_false,_false>
              *)&gtest_ar.message_);
  libcellml::GeneratorProfile::interfaceVoiInfoString_abi_cxx11_();
  testing::internal::EqHelper<false>::Compare<char[37],std::__cxx11::string>
            ((EqHelper<false> *)local_640,"\"extern const VariableInfo VOI_INFO;\\n\"",
             "generatorProfile->interfaceVoiInfoString()",
             (char (*) [37])"extern const VariableInfo VOI_INFO;\n",&local_660);
  std::__cxx11::string::~string((string *)&local_660);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_640);
  if (!bVar1) {
    testing::Message::Message(local_668);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_640);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_25.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/generator/generatorprofile.cpp"
               ,0x14b,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_25.message_,local_668);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_25.message_);
    testing::Message::~Message(local_668);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_640);
  std::__shared_ptr_access<libcellml::GeneratorProfile,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
  operator->((__shared_ptr_access<libcellml::GeneratorProfile,_(__gnu_cxx::_Lock_policy)2,_false,_false>
              *)&gtest_ar.message_);
  libcellml::GeneratorProfile::implementationVoiInfoString_abi_cxx11_();
  testing::internal::EqHelper<false>::Compare<char[39],std::__cxx11::string>
            ((EqHelper<false> *)local_680,"\"const VariableInfo VOI_INFO = [CODE];\\n\"",
             "generatorProfile->implementationVoiInfoString()",
             (char (*) [39])"const VariableInfo VOI_INFO = [CODE];\n",&local_6a0);
  std::__cxx11::string::~string((string *)&local_6a0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_680);
  if (!bVar1) {
    testing::Message::Message(local_6a8);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_680);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_26.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/generator/generatorprofile.cpp"
               ,0x14c,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_26.message_,local_6a8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_26.message_);
    testing::Message::~Message(local_6a8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_680);
  std::__shared_ptr_access<libcellml::GeneratorProfile,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
  operator->((__shared_ptr_access<libcellml::GeneratorProfile,_(__gnu_cxx::_Lock_policy)2,_false,_false>
              *)&gtest_ar.message_);
  libcellml::GeneratorProfile::interfaceStateInfoString_abi_cxx11_();
  testing::internal::EqHelper<false>::Compare<char[41],std::__cxx11::string>
            ((EqHelper<false> *)local_6c0,"\"extern const VariableInfo STATE_INFO[];\\n\"",
             "generatorProfile->interfaceStateInfoString()",
             (char (*) [41])"extern const VariableInfo STATE_INFO[];\n",&local_6e0);
  std::__cxx11::string::~string((string *)&local_6e0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_6c0);
  if (!bVar1) {
    testing::Message::Message(local_6e8);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_6c0);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_27.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/generator/generatorprofile.cpp"
               ,0x14e,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_27.message_,local_6e8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_27.message_);
    testing::Message::~Message(local_6e8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_6c0);
  std::__shared_ptr_access<libcellml::GeneratorProfile,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
  operator->((__shared_ptr_access<libcellml::GeneratorProfile,_(__gnu_cxx::_Lock_policy)2,_false,_false>
              *)&gtest_ar.message_);
  libcellml::GeneratorProfile::implementationStateInfoString_abi_cxx11_();
  testing::internal::EqHelper<false>::Compare<char[46],std::__cxx11::string>
            ((EqHelper<false> *)local_700,
             "\"const VariableInfo STATE_INFO[] = {\\n\" \"[CODE]\" \"};\\n\"",
             "generatorProfile->implementationStateInfoString()",
             (char (*) [46])"const VariableInfo STATE_INFO[] = {\n[CODE]};\n",&local_720);
  std::__cxx11::string::~string((string *)&local_720);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_700);
  if (!bVar1) {
    testing::Message::Message(local_728);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_700);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_28.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/generator/generatorprofile.cpp"
               ,0x152,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_28.message_,local_728);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_28.message_);
    testing::Message::~Message(local_728);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_700);
  std::__shared_ptr_access<libcellml::GeneratorProfile,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
  operator->((__shared_ptr_access<libcellml::GeneratorProfile,_(__gnu_cxx::_Lock_policy)2,_false,_false>
              *)&gtest_ar.message_);
  libcellml::GeneratorProfile::interfaceVariableInfoString_abi_cxx11_();
  testing::internal::EqHelper<false>::Compare<char[44],std::__cxx11::string>
            ((EqHelper<false> *)local_740,"\"extern const VariableInfo VARIABLE_INFO[];\\n\"",
             "generatorProfile->interfaceVariableInfoString()",
             (char (*) [44])"extern const VariableInfo VARIABLE_INFO[];\n",&local_760);
  std::__cxx11::string::~string((string *)&local_760);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_740);
  if (!bVar1) {
    testing::Message::Message(local_768);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_740);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_29.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/generator/generatorprofile.cpp"
               ,0x154,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_29.message_,local_768);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_29.message_);
    testing::Message::~Message(local_768);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_740);
  std::__shared_ptr_access<libcellml::GeneratorProfile,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
  operator->((__shared_ptr_access<libcellml::GeneratorProfile,_(__gnu_cxx::_Lock_policy)2,_false,_false>
              *)&gtest_ar.message_);
  libcellml::GeneratorProfile::implementationVariableInfoString_abi_cxx11_();
  testing::internal::EqHelper<false>::Compare<char[49],std::__cxx11::string>
            ((EqHelper<false> *)local_780,
             "\"const VariableInfo VARIABLE_INFO[] = {\\n\" \"[CODE]\" \"};\\n\"",
             "generatorProfile->implementationVariableInfoString()",
             (char (*) [49])"const VariableInfo VARIABLE_INFO[] = {\n[CODE]};\n",&local_7a0);
  std::__cxx11::string::~string((string *)&local_7a0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_780);
  if (!bVar1) {
    testing::Message::Message(local_7a8);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_780);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_30.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/generator/generatorprofile.cpp"
               ,0x158,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_30.message_,local_7a8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_30.message_);
    testing::Message::~Message(local_7a8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_780);
  std::__shared_ptr_access<libcellml::GeneratorProfile,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
  operator->((__shared_ptr_access<libcellml::GeneratorProfile,_(__gnu_cxx::_Lock_policy)2,_false,_false>
              *)&gtest_ar.message_);
  libcellml::GeneratorProfile::variableInfoEntryString_abi_cxx11_();
  testing::internal::EqHelper<false>::Compare<char[45],std::__cxx11::string>
            ((EqHelper<false> *)local_7c0,
             "\"{\\\"[NAME]\\\", \\\"[UNITS]\\\", \\\"[COMPONENT]\\\", [TYPE]}\"",
             "generatorProfile->variableInfoEntryString()",
             (char (*) [45])"{\"[NAME]\", \"[UNITS]\", \"[COMPONENT]\", [TYPE]}",&local_7e0);
  std::__cxx11::string::~string((string *)&local_7e0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_7c0);
  if (!bVar1) {
    testing::Message::Message(local_7e8);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_7c0);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_31.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/generator/generatorprofile.cpp"
               ,0x15a,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_31.message_,local_7e8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_31.message_);
    testing::Message::~Message(local_7e8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_7c0);
  std::__shared_ptr_access<libcellml::GeneratorProfile,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
  operator->((__shared_ptr_access<libcellml::GeneratorProfile,_(__gnu_cxx::_Lock_policy)2,_false,_false>
              *)&gtest_ar.message_);
  libcellml::GeneratorProfile::voiString_abi_cxx11_();
  testing::internal::EqHelper<false>::Compare<char[4],std::__cxx11::string>
            ((EqHelper<false> *)local_800,"\"voi\"","generatorProfile->voiString()",
             (char (*) [4])"voi",&local_820);
  std::__cxx11::string::~string((string *)&local_820);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_800);
  if (!bVar1) {
    testing::Message::Message(local_828);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_800);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_32.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/generator/generatorprofile.cpp"
               ,0x15c,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_32.message_,local_828);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_32.message_);
    testing::Message::~Message(local_828);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_800);
  std::__shared_ptr_access<libcellml::GeneratorProfile,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
  operator->((__shared_ptr_access<libcellml::GeneratorProfile,_(__gnu_cxx::_Lock_policy)2,_false,_false>
              *)&gtest_ar.message_);
  libcellml::GeneratorProfile::statesArrayString_abi_cxx11_();
  testing::internal::EqHelper<false>::Compare<char[7],std::__cxx11::string>
            ((EqHelper<false> *)local_840,"\"states\"","generatorProfile->statesArrayString()",
             (char (*) [7])"states",&local_860);
  std::__cxx11::string::~string((string *)&local_860);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_840);
  if (!bVar1) {
    testing::Message::Message(local_868);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_840);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_33.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/generator/generatorprofile.cpp"
               ,0x15e,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_33.message_,local_868);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_33.message_);
    testing::Message::~Message(local_868);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_840);
  std::__shared_ptr_access<libcellml::GeneratorProfile,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
  operator->((__shared_ptr_access<libcellml::GeneratorProfile,_(__gnu_cxx::_Lock_policy)2,_false,_false>
              *)&gtest_ar.message_);
  libcellml::GeneratorProfile::ratesArrayString_abi_cxx11_();
  testing::internal::EqHelper<false>::Compare<char[6],std::__cxx11::string>
            ((EqHelper<false> *)local_880,"\"rates\"","generatorProfile->ratesArrayString()",
             (char (*) [6])"rates",&local_8a0);
  std::__cxx11::string::~string((string *)&local_8a0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_880);
  if (!bVar1) {
    testing::Message::Message(local_8a8);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_880);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_34.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/generator/generatorprofile.cpp"
               ,0x15f,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_34.message_,local_8a8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_34.message_);
    testing::Message::~Message(local_8a8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_880);
  std::__shared_ptr_access<libcellml::GeneratorProfile,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
  operator->((__shared_ptr_access<libcellml::GeneratorProfile,_(__gnu_cxx::_Lock_policy)2,_false,_false>
              *)&gtest_ar.message_);
  libcellml::GeneratorProfile::variablesArrayString_abi_cxx11_();
  testing::internal::EqHelper<false>::Compare<char[10],std::__cxx11::string>
            ((EqHelper<false> *)local_8c0,"\"variables\"","generatorProfile->variablesArrayString()"
             ,(char (*) [10])"variables",&local_8e0);
  std::__cxx11::string::~string((string *)&local_8e0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_8c0);
  if (!bVar1) {
    testing::Message::Message(local_8e8);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_8c0);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_35.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/generator/generatorprofile.cpp"
               ,0x160,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_35.message_,local_8e8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_35.message_);
    testing::Message::~Message(local_8e8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_8c0);
  std::__shared_ptr_access<libcellml::GeneratorProfile,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
  operator->((__shared_ptr_access<libcellml::GeneratorProfile,_(__gnu_cxx::_Lock_policy)2,_false,_false>
              *)&gtest_ar.message_);
  libcellml::GeneratorProfile::externalVariableMethodTypeDefinitionString_abi_cxx11_
            (SUB81(&local_920,0));
  testing::internal::EqHelper<false>::Compare<char[71],std::__cxx11::string>
            ((EqHelper<false> *)local_900,
             "\"typedef double (* ExternalVariable)(double *variables, size_t index);\\n\"",
             "generatorProfile->externalVariableMethodTypeDefinitionString(false)",
             (char (*) [71])
             "typedef double (* ExternalVariable)(double *variables, size_t index);\n",&local_920);
  std::__cxx11::string::~string((string *)&local_920);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_900);
  if (!bVar1) {
    testing::Message::Message(local_928);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_900);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_36.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/generator/generatorprofile.cpp"
               ,0x162,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_36.message_,local_928);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_36.message_);
    testing::Message::~Message(local_928);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_900);
  std::__shared_ptr_access<libcellml::GeneratorProfile,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
  operator->((__shared_ptr_access<libcellml::GeneratorProfile,_(__gnu_cxx::_Lock_policy)2,_false,_false>
              *)&gtest_ar.message_);
  libcellml::GeneratorProfile::externalVariableMethodTypeDefinitionString_abi_cxx11_
            (SUB81(&local_960,0));
  testing::internal::EqHelper<false>::Compare<char[114],std::__cxx11::string>
            ((EqHelper<false> *)local_940,
             "\"typedef double (* ExternalVariable)(double voi, double *states, double *rates, double *variables, size_t index);\\n\""
             ,"generatorProfile->externalVariableMethodTypeDefinitionString(true)",
             (char (*) [114])
             "typedef double (* ExternalVariable)(double voi, double *states, double *rates, double *variables, size_t index);\n"
             ,&local_960);
  std::__cxx11::string::~string((string *)&local_960);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_940);
  if (!bVar1) {
    testing::Message::Message(local_968);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_940);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_37.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/generator/generatorprofile.cpp"
               ,0x163,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_37.message_,local_968);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_37.message_);
    testing::Message::~Message(local_968);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_940);
  std::__shared_ptr_access<libcellml::GeneratorProfile,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
  operator->((__shared_ptr_access<libcellml::GeneratorProfile,_(__gnu_cxx::_Lock_policy)2,_false,_false>
              *)&gtest_ar.message_);
  libcellml::GeneratorProfile::externalVariableMethodCallString_abi_cxx11_(SUB81(&local_9a0,0));
  testing::internal::EqHelper<false>::Compare<char[37],std::__cxx11::string>
            ((EqHelper<false> *)local_980,"\"externalVariable(variables, [INDEX])\"",
             "generatorProfile->externalVariableMethodCallString(false)",
             (char (*) [37])"externalVariable(variables, [INDEX])",&local_9a0);
  std::__cxx11::string::~string((string *)&local_9a0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_980);
  if (!bVar1) {
    testing::Message::Message(local_9a8);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_980);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_38.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/generator/generatorprofile.cpp"
               ,0x165,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_38.message_,local_9a8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_38.message_);
    testing::Message::~Message(local_9a8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_980);
  std::__shared_ptr_access<libcellml::GeneratorProfile,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
  operator->((__shared_ptr_access<libcellml::GeneratorProfile,_(__gnu_cxx::_Lock_policy)2,_false,_false>
              *)&gtest_ar.message_);
  libcellml::GeneratorProfile::externalVariableMethodCallString_abi_cxx11_(SUB81(&local_9e0,0));
  testing::internal::EqHelper<false>::Compare<char[57],std::__cxx11::string>
            ((EqHelper<false> *)local_9c0,
             "\"externalVariable(voi, states, rates, variables, [INDEX])\"",
             "generatorProfile->externalVariableMethodCallString(true)",
             (char (*) [57])"externalVariable(voi, states, rates, variables, [INDEX])",&local_9e0);
  std::__cxx11::string::~string((string *)&local_9e0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_9c0);
  if (!bVar1) {
    testing::Message::Message(local_9e8);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_9c0);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_39.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/generator/generatorprofile.cpp"
               ,0x166,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_39.message_,local_9e8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_39.message_);
    testing::Message::~Message(local_9e8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_9c0);
  std::__shared_ptr_access<libcellml::GeneratorProfile,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
  operator->((__shared_ptr_access<libcellml::GeneratorProfile,_(__gnu_cxx::_Lock_policy)2,_false,_false>
              *)&gtest_ar.message_);
  libcellml::GeneratorProfile::interfaceCreateStatesArrayMethodString_abi_cxx11_();
  testing::internal::EqHelper<false>::Compare<char[31],std::__cxx11::string>
            ((EqHelper<false> *)local_a00,"\"double * createStatesArray();\\n\"",
             "generatorProfile->interfaceCreateStatesArrayMethodString()",
             (char (*) [31])"double * createStatesArray();\n",&local_a20);
  std::__cxx11::string::~string((string *)&local_a20);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_a00);
  if (!bVar1) {
    testing::Message::Message(local_a28);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_a00);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_40.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/generator/generatorprofile.cpp"
               ,0x169,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_40.message_,local_a28);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_40.message_);
    testing::Message::~Message(local_a28);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_a00);
  std::__shared_ptr_access<libcellml::GeneratorProfile,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
  operator->((__shared_ptr_access<libcellml::GeneratorProfile,_(__gnu_cxx::_Lock_policy)2,_false,_false>
              *)&gtest_ar.message_);
  libcellml::GeneratorProfile::implementationCreateStatesArrayMethodString_abi_cxx11_();
  testing::internal::EqHelper<false>::Compare<char[192],std::__cxx11::string>
            ((EqHelper<false> *)local_a40,
             "\"double * createStatesArray()\\n\" \"{\\n\" \"    double *res = (double *) malloc(STATE_COUNT*sizeof(double));\\n\" \"\\n\" \"    for (size_t i = 0; i < STATE_COUNT; ++i) {\\n\" \"        res[i] = NAN;\\n\" \"    }\\n\" \"\\n\" \"    return res;\\n\" \"}\\n\""
             ,"generatorProfile->implementationCreateStatesArrayMethodString()",
             (char (*) [192])
             "double * createStatesArray()\n{\n    double *res = (double *) malloc(STATE_COUNT*sizeof(double));\n\n    for (size_t i = 0; i < STATE_COUNT; ++i) {\n        res[i] = NAN;\n    }\n\n    return res;\n}\n"
             ,&local_a60);
  std::__cxx11::string::~string((string *)&local_a60);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_a40);
  if (!bVar1) {
    testing::Message::Message(local_a68);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_a40);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_41.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/generator/generatorprofile.cpp"
               ,0x174,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_41.message_,local_a68);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_41.message_);
    testing::Message::~Message(local_a68);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_a40);
  std::__shared_ptr_access<libcellml::GeneratorProfile,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
  operator->((__shared_ptr_access<libcellml::GeneratorProfile,_(__gnu_cxx::_Lock_policy)2,_false,_false>
              *)&gtest_ar.message_);
  libcellml::GeneratorProfile::rootFindingInfoObjectString_abi_cxx11_(SUB81(&local_aa0,0));
  testing::internal::EqHelper<false>::Compare<char[60],std::__cxx11::string>
            ((EqHelper<false> *)local_a80,
             "\"typedef struct {\\n\" \"    double *variables;\\n\" \"} RootFindingInfo;\\n\"",
             "generatorProfile->rootFindingInfoObjectString(false)",
             (char (*) [60])"typedef struct {\n    double *variables;\n} RootFindingInfo;\n",
             &local_aa0);
  std::__cxx11::string::~string((string *)&local_aa0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_a80);
  if (!bVar1) {
    testing::Message::Message(local_aa8);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_a80);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_42.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/generator/generatorprofile.cpp"
               ,0x179,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_42.message_,local_aa8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_42.message_);
    testing::Message::~Message(local_aa8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_a80);
  std::__shared_ptr_access<libcellml::GeneratorProfile,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
  operator->((__shared_ptr_access<libcellml::GeneratorProfile,_(__gnu_cxx::_Lock_policy)2,_false,_false>
              *)&gtest_ar.message_);
  libcellml::GeneratorProfile::rootFindingInfoObjectString_abi_cxx11_(SUB81(&local_ae0,0));
  testing::internal::EqHelper<false>::Compare<char[115],std::__cxx11::string>
            ((EqHelper<false> *)local_ac0,
             "\"typedef struct {\\n\" \"    double voi;\\n\" \"    double *states;\\n\" \"    double *rates;\\n\" \"    double *variables;\\n\" \"} RootFindingInfo;\\n\""
             ,"generatorProfile->rootFindingInfoObjectString(true)",
             (char (*) [115])
             "typedef struct {\n    double voi;\n    double *states;\n    double *rates;\n    double *variables;\n} RootFindingInfo;\n"
             ,&local_ae0);
  std::__cxx11::string::~string((string *)&local_ae0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_ac0);
  if (!bVar1) {
    testing::Message::Message(local_ae8);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_ac0);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_43.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/generator/generatorprofile.cpp"
               ,0x180,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_43.message_,local_ae8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_43.message_);
    testing::Message::~Message(local_ae8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_ac0);
  std::__shared_ptr_access<libcellml::GeneratorProfile,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
  operator->((__shared_ptr_access<libcellml::GeneratorProfile,_(__gnu_cxx::_Lock_policy)2,_false,_false>
              *)&gtest_ar.message_);
  libcellml::GeneratorProfile::externNlaSolveMethodString_abi_cxx11_();
  testing::internal::EqHelper<false>::Compare<char[132],std::__cxx11::string>
            ((EqHelper<false> *)local_b00,
             "\"extern void nlaSolve(void (*objectiveFunction)(double *, double *, void *),\\n\" \"                     double *u, size_t n, void *data);\\n\""
             ,"generatorProfile->externNlaSolveMethodString()",
             (char (*) [132])
             "extern void nlaSolve(void (*objectiveFunction)(double *, double *, void *),\n                     double *u, size_t n, void *data);\n"
             ,&local_b20);
  std::__cxx11::string::~string((string *)&local_b20);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_b00);
  if (!bVar1) {
    testing::Message::Message(local_b28);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_b00);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_44.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/generator/generatorprofile.cpp"
               ,0x183,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_44.message_,local_b28);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_44.message_);
    testing::Message::~Message(local_b28);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_b00);
  std::__shared_ptr_access<libcellml::GeneratorProfile,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
  operator->((__shared_ptr_access<libcellml::GeneratorProfile,_(__gnu_cxx::_Lock_policy)2,_false,_false>
              *)&gtest_ar.message_);
  libcellml::GeneratorProfile::findRootCallString_abi_cxx11_(SUB81(&local_b60,0));
  testing::internal::EqHelper<false>::Compare<char[29],std::__cxx11::string>
            ((EqHelper<false> *)local_b40,"\"findRoot[INDEX](variables);\\n\"",
             "generatorProfile->findRootCallString(false)",
             (char (*) [29])"findRoot[INDEX](variables);\n",&local_b60);
  std::__cxx11::string::~string((string *)&local_b60);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_b40);
  if (!bVar1) {
    testing::Message::Message(local_b68);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_b40);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_45.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/generator/generatorprofile.cpp"
               ,0x185,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_45.message_,local_b68);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_45.message_);
    testing::Message::~Message(local_b68);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_b40);
  std::__shared_ptr_access<libcellml::GeneratorProfile,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
  operator->((__shared_ptr_access<libcellml::GeneratorProfile,_(__gnu_cxx::_Lock_policy)2,_false,_false>
              *)&gtest_ar.message_);
  libcellml::GeneratorProfile::findRootCallString_abi_cxx11_(SUB81(&local_ba0,0));
  testing::internal::EqHelper<false>::Compare<char[49],std::__cxx11::string>
            ((EqHelper<false> *)local_b80,"\"findRoot[INDEX](voi, states, rates, variables);\\n\"",
             "generatorProfile->findRootCallString(true)",
             (char (*) [49])"findRoot[INDEX](voi, states, rates, variables);\n",&local_ba0);
  std::__cxx11::string::~string((string *)&local_ba0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_b80);
  if (!bVar1) {
    testing::Message::Message(local_ba8);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_b80);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_46.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/generator/generatorprofile.cpp"
               ,0x187,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_46.message_,local_ba8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_46.message_);
    testing::Message::~Message(local_ba8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_b80);
  std::__shared_ptr_access<libcellml::GeneratorProfile,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
  operator->((__shared_ptr_access<libcellml::GeneratorProfile,_(__gnu_cxx::_Lock_policy)2,_false,_false>
              *)&gtest_ar.message_);
  libcellml::GeneratorProfile::findRootMethodString_abi_cxx11_(SUB81(&local_be0,0));
  testing::internal::EqHelper<false>::Compare<char[115],std::__cxx11::string>
            ((EqHelper<false> *)local_bc0,
             "\"void findRoot[INDEX](double *variables)\\n\" \"{\\n\" \"    RootFindingInfo rfi = { variables };\\n\" \"    double u[[SIZE]];\\n\" \"\\n\" \"[CODE]\" \"}\\n\""
             ,"generatorProfile->findRootMethodString(false)",
             (char (*) [115])
             "void findRoot[INDEX](double *variables)\n{\n    RootFindingInfo rfi = { variables };\n    double u[[SIZE]];\n\n[CODE]}\n"
             ,&local_be0);
  std::__cxx11::string::~string((string *)&local_be0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_bc0);
  if (!bVar1) {
    testing::Message::Message(local_be8);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_bc0);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_47.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/generator/generatorprofile.cpp"
               ,399,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_47.message_,local_be8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_47.message_);
    testing::Message::~Message(local_be8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_bc0);
  std::__shared_ptr_access<libcellml::GeneratorProfile,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
  operator->((__shared_ptr_access<libcellml::GeneratorProfile,_(__gnu_cxx::_Lock_policy)2,_false,_false>
              *)&gtest_ar.message_);
  libcellml::GeneratorProfile::findRootMethodString_abi_cxx11_(SUB81(&local_c20,0));
  testing::internal::EqHelper<false>::Compare<char[178],std::__cxx11::string>
            ((EqHelper<false> *)local_c00,
             "\"void findRoot[INDEX](double voi, double *states, double *rates, double *variables)\\n\" \"{\\n\" \"    RootFindingInfo rfi = { voi, states, rates, variables };\\n\" \"    double u[[SIZE]];\\n\" \"\\n\" \"[CODE]\" \"}\\n\""
             ,"generatorProfile->findRootMethodString(true)",
             (char (*) [178])
             "void findRoot[INDEX](double voi, double *states, double *rates, double *variables)\n{\n    RootFindingInfo rfi = { voi, states, rates, variables };\n    double u[[SIZE]];\n\n[CODE]}\n"
             ,&local_c20);
  std::__cxx11::string::~string((string *)&local_c20);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_c00);
  if (!bVar1) {
    testing::Message::Message(local_c28);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_c00);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_48.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/generator/generatorprofile.cpp"
               ,0x197,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_48.message_,local_c28);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_48.message_);
    testing::Message::~Message(local_c28);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_c00);
  std::__shared_ptr_access<libcellml::GeneratorProfile,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
  operator->((__shared_ptr_access<libcellml::GeneratorProfile,_(__gnu_cxx::_Lock_policy)2,_false,_false>
              *)&gtest_ar.message_);
  libcellml::GeneratorProfile::nlaSolveCallString_abi_cxx11_(SUB81(&local_c60,0));
  testing::internal::EqHelper<false>::Compare<char[54],std::__cxx11::string>
            ((EqHelper<false> *)local_c40,
             "\"nlaSolve(objectiveFunction[INDEX], u, [SIZE], &rfi);\\n\"",
             "generatorProfile->nlaSolveCallString(false)",
             (char (*) [54])"nlaSolve(objectiveFunction[INDEX], u, [SIZE], &rfi);\n",&local_c60);
  std::__cxx11::string::~string((string *)&local_c60);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_c40);
  if (!bVar1) {
    testing::Message::Message(local_c68);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_c40);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_49.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/generator/generatorprofile.cpp"
               ,0x199,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_49.message_,local_c68);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_49.message_);
    testing::Message::~Message(local_c68);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_c40);
  std::__shared_ptr_access<libcellml::GeneratorProfile,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
  operator->((__shared_ptr_access<libcellml::GeneratorProfile,_(__gnu_cxx::_Lock_policy)2,_false,_false>
              *)&gtest_ar.message_);
  libcellml::GeneratorProfile::nlaSolveCallString_abi_cxx11_(SUB81(&local_ca0,0));
  testing::internal::EqHelper<false>::Compare<char[54],std::__cxx11::string>
            ((EqHelper<false> *)local_c80,
             "\"nlaSolve(objectiveFunction[INDEX], u, [SIZE], &rfi);\\n\"",
             "generatorProfile->nlaSolveCallString(true)",
             (char (*) [54])"nlaSolve(objectiveFunction[INDEX], u, [SIZE], &rfi);\n",&local_ca0);
  std::__cxx11::string::~string((string *)&local_ca0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_c80);
  if (!bVar1) {
    testing::Message::Message(local_ca8);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_c80);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_50.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/generator/generatorprofile.cpp"
               ,0x19b,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_50.message_,local_ca8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_50.message_);
    testing::Message::~Message(local_ca8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_c80);
  std::__shared_ptr_access<libcellml::GeneratorProfile,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
  operator->((__shared_ptr_access<libcellml::GeneratorProfile,_(__gnu_cxx::_Lock_policy)2,_false,_false>
              *)&gtest_ar.message_);
  libcellml::GeneratorProfile::objectiveFunctionMethodString_abi_cxx11_(SUB81(&local_ce0,0));
  testing::internal::EqHelper<false>::Compare<char[139],std::__cxx11::string>
            ((EqHelper<false> *)local_cc0,
             "\"void objectiveFunction[INDEX](double *u, double *f, void *data)\\n\" \"{\\n\" \"    double *variables = ((RootFindingInfo *) data)->variables;\\n\" \"\\n\" \"[CODE]\" \"}\\n\""
             ,"generatorProfile->objectiveFunctionMethodString(false)",
             (char (*) [139])
             "void objectiveFunction[INDEX](double *u, double *f, void *data)\n{\n    double *variables = ((RootFindingInfo *) data)->variables;\n\n[CODE]}\n"
             ,&local_ce0);
  std::__cxx11::string::~string((string *)&local_ce0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_cc0);
  if (!bVar1) {
    testing::Message::Message(local_ce8);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_cc0);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_51.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/generator/generatorprofile.cpp"
               ,0x1a2,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_51.message_,local_ce8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_51.message_);
    testing::Message::~Message(local_ce8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_cc0);
  std::__shared_ptr_access<libcellml::GeneratorProfile,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
  operator->((__shared_ptr_access<libcellml::GeneratorProfile,_(__gnu_cxx::_Lock_policy)2,_false,_false>
              *)&gtest_ar.message_);
  libcellml::GeneratorProfile::objectiveFunctionMethodString_abi_cxx11_(SUB81(&local_d20,0));
  testing::internal::EqHelper<false>::Compare<char[301],std::__cxx11::string>
            ((EqHelper<false> *)local_d00,
             "\"void objectiveFunction[INDEX](double *u, double *f, void *data)\\n\" \"{\\n\" \"    double voi = ((RootFindingInfo *) data)->voi;\\n\" \"    double *states = ((RootFindingInfo *) data)->states;\\n\" \"    double *rates = ((RootFindingInfo *) data)->rates;\\n\" \"    double *variables = ((RootFindingInfo *) data)->variables;\\n\" \"\\n\" \"[CODE]\" \"}\\n\""
             ,"generatorProfile->objectiveFunctionMethodString(true)",
             (char (*) [301])
             "void objectiveFunction[INDEX](double *u, double *f, void *data)\n{\n    double voi = ((RootFindingInfo *) data)->voi;\n    double *states = ((RootFindingInfo *) data)->states;\n    double *rates = ((RootFindingInfo *) data)->rates;\n    double *variables = ((RootFindingInfo *) data)->variables;\n\n[CODE]}\n"
             ,&local_d20);
  std::__cxx11::string::~string((string *)&local_d20);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_d00);
  if (!bVar1) {
    testing::Message::Message(local_d28);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_d00);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_52.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/generator/generatorprofile.cpp"
               ,0x1ac,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_52.message_,local_d28);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_52.message_);
    testing::Message::~Message(local_d28);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_d00);
  std::__shared_ptr_access<libcellml::GeneratorProfile,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
  operator->((__shared_ptr_access<libcellml::GeneratorProfile,_(__gnu_cxx::_Lock_policy)2,_false,_false>
              *)&gtest_ar.message_);
  libcellml::GeneratorProfile::uArrayString_abi_cxx11_();
  testing::internal::EqHelper<false>::Compare<char[2],std::__cxx11::string>
            ((EqHelper<false> *)local_d40,"\"u\"","generatorProfile->uArrayString()",
             (char (*) [2])"u",&local_d60);
  std::__cxx11::string::~string((string *)&local_d60);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_d40);
  if (!bVar1) {
    testing::Message::Message(local_d68);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_d40);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_53.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/generator/generatorprofile.cpp"
               ,0x1ae,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_53.message_,local_d68);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_53.message_);
    testing::Message::~Message(local_d68);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_d40);
  std::__shared_ptr_access<libcellml::GeneratorProfile,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
  operator->((__shared_ptr_access<libcellml::GeneratorProfile,_(__gnu_cxx::_Lock_policy)2,_false,_false>
              *)&gtest_ar.message_);
  libcellml::GeneratorProfile::fArrayString_abi_cxx11_();
  testing::internal::EqHelper<false>::Compare<char[2],std::__cxx11::string>
            ((EqHelper<false> *)local_d80,"\"f\"","generatorProfile->fArrayString()",
             (char (*) [2])"f",&local_da0);
  std::__cxx11::string::~string((string *)&local_da0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_d80);
  if (!bVar1) {
    testing::Message::Message(local_da8);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_d80);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_54.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/generator/generatorprofile.cpp"
               ,0x1b0,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_54.message_,local_da8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_54.message_);
    testing::Message::~Message(local_da8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_d80);
  std::__shared_ptr_access<libcellml::GeneratorProfile,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
  operator->((__shared_ptr_access<libcellml::GeneratorProfile,_(__gnu_cxx::_Lock_policy)2,_false,_false>
              *)&gtest_ar.message_);
  libcellml::GeneratorProfile::interfaceCreateVariablesArrayMethodString_abi_cxx11_();
  testing::internal::EqHelper<false>::Compare<char[34],std::__cxx11::string>
            ((EqHelper<false> *)local_dc0,"\"double * createVariablesArray();\\n\"",
             "generatorProfile->interfaceCreateVariablesArrayMethodString()",
             (char (*) [34])"double * createVariablesArray();\n",&local_de0);
  std::__cxx11::string::~string((string *)&local_de0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_dc0);
  if (!bVar1) {
    testing::Message::Message(local_de8);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_dc0);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_55.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/generator/generatorprofile.cpp"
               ,0x1b3,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_55.message_,local_de8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_55.message_);
    testing::Message::~Message(local_de8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_dc0);
  std::__shared_ptr_access<libcellml::GeneratorProfile,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
  operator->((__shared_ptr_access<libcellml::GeneratorProfile,_(__gnu_cxx::_Lock_policy)2,_false,_false>
              *)&gtest_ar.message_);
  libcellml::GeneratorProfile::implementationCreateVariablesArrayMethodString_abi_cxx11_();
  testing::internal::EqHelper<false>::Compare<char[201],std::__cxx11::string>
            ((EqHelper<false> *)local_e00,
             "\"double * createVariablesArray()\\n\" \"{\\n\" \"    double *res = (double *) malloc(VARIABLE_COUNT*sizeof(double));\\n\" \"\\n\" \"    for (size_t i = 0; i < VARIABLE_COUNT; ++i) {\\n\" \"        res[i] = NAN;\\n\" \"    }\\n\" \"\\n\" \"    return res;\\n\" \"}\\n\""
             ,"generatorProfile->implementationCreateVariablesArrayMethodString()",
             (char (*) [201])
             "double * createVariablesArray()\n{\n    double *res = (double *) malloc(VARIABLE_COUNT*sizeof(double));\n\n    for (size_t i = 0; i < VARIABLE_COUNT; ++i) {\n        res[i] = NAN;\n    }\n\n    return res;\n}\n"
             ,&local_e20);
  std::__cxx11::string::~string((string *)&local_e20);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_e00);
  if (!bVar1) {
    testing::Message::Message(local_e28);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_e00);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_56.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/generator/generatorprofile.cpp"
               ,0x1be,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_56.message_,local_e28);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_56.message_);
    testing::Message::~Message(local_e28);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_e00);
  std::__shared_ptr_access<libcellml::GeneratorProfile,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
  operator->((__shared_ptr_access<libcellml::GeneratorProfile,_(__gnu_cxx::_Lock_policy)2,_false,_false>
              *)&gtest_ar.message_);
  libcellml::GeneratorProfile::interfaceDeleteArrayMethodString_abi_cxx11_();
  testing::internal::EqHelper<false>::Compare<char[34],std::__cxx11::string>
            ((EqHelper<false> *)local_e40,"\"void deleteArray(double *array);\\n\"",
             "generatorProfile->interfaceDeleteArrayMethodString()",
             (char (*) [34])"void deleteArray(double *array);\n",&local_e60);
  std::__cxx11::string::~string((string *)&local_e60);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_e40);
  if (!bVar1) {
    testing::Message::Message(local_e68);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_e40);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_57.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/generator/generatorprofile.cpp"
               ,0x1c1,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_57.message_,local_e68);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_57.message_);
    testing::Message::~Message(local_e68);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_e40);
  std::__shared_ptr_access<libcellml::GeneratorProfile,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
  operator->((__shared_ptr_access<libcellml::GeneratorProfile,_(__gnu_cxx::_Lock_policy)2,_false,_false>
              *)&gtest_ar.message_);
  libcellml::GeneratorProfile::implementationDeleteArrayMethodString_abi_cxx11_();
  testing::internal::EqHelper<false>::Compare<char[54],std::__cxx11::string>
            ((EqHelper<false> *)local_e80,
             "\"void deleteArray(double *array)\\n\" \"{\\n\" \"    free(array);\\n\" \"}\\n\"",
             "generatorProfile->implementationDeleteArrayMethodString()",
             (char (*) [54])"void deleteArray(double *array)\n{\n    free(array);\n}\n",&local_ea0);
  std::__cxx11::string::~string((string *)&local_ea0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_e80);
  if (!bVar1) {
    testing::Message::Message(local_ea8);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_e80);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_58.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/generator/generatorprofile.cpp"
               ,0x1c6,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_58.message_,local_ea8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_58.message_);
    testing::Message::~Message(local_ea8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_e80);
  peVar3 = std::
           __shared_ptr_access<libcellml::GeneratorProfile,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<libcellml::GeneratorProfile,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)&gtest_ar.message_);
  libcellml::GeneratorProfile::interfaceInitialiseVariablesMethodString_abi_cxx11_
            (SUB81(&local_ee0,0),SUB81(peVar3,0));
  testing::internal::EqHelper<false>::Compare<char[46],std::__cxx11::string>
            ((EqHelper<false> *)local_ec0,"\"void initialiseVariables(double *variables);\\n\"",
             "generatorProfile->interfaceInitialiseVariablesMethodString(false, false)",
             (char (*) [46])"void initialiseVariables(double *variables);\n",&local_ee0);
  std::__cxx11::string::~string((string *)&local_ee0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_ec0);
  if (!bVar1) {
    testing::Message::Message(local_ee8);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_ec0);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_59.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/generator/generatorprofile.cpp"
               ,0x1c9,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_59.message_,local_ee8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_59.message_);
    testing::Message::~Message(local_ee8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_ec0);
  peVar3 = std::
           __shared_ptr_access<libcellml::GeneratorProfile,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<libcellml::GeneratorProfile,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)&gtest_ar.message_);
  libcellml::GeneratorProfile::implementationInitialiseVariablesMethodString_abi_cxx11_
            (SUB81(&local_f20,0),SUB81(peVar3,0));
  testing::internal::EqHelper<false>::Compare<char[55],std::__cxx11::string>
            ((EqHelper<false> *)local_f00,
             "\"void initialiseVariables(double *variables)\\n\" \"{\\n\" \"[CODE]\" \"}\\n\"",
             "generatorProfile->implementationInitialiseVariablesMethodString(false, false)",
             (char (*) [55])"void initialiseVariables(double *variables)\n{\n[CODE]}\n",&local_f20);
  std::__cxx11::string::~string((string *)&local_f20);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_f00);
  if (!bVar1) {
    testing::Message::Message(local_f28);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_f00);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_60.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/generator/generatorprofile.cpp"
               ,0x1ce,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_60.message_,local_f28);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_60.message_);
    testing::Message::~Message(local_f28);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_f00);
  peVar3 = std::
           __shared_ptr_access<libcellml::GeneratorProfile,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<libcellml::GeneratorProfile,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)&gtest_ar.message_);
  libcellml::GeneratorProfile::interfaceInitialiseVariablesMethodString_abi_cxx11_
            (SUB81(&local_f60,0),SUB81(peVar3,0));
  testing::internal::EqHelper<false>::Compare<char[81],std::__cxx11::string>
            ((EqHelper<false> *)local_f40,
             "\"void initialiseVariables(double *variables, ExternalVariable externalVariable);\\n\""
             ,"generatorProfile->interfaceInitialiseVariablesMethodString(false, true)",
             (char (*) [81])
             "void initialiseVariables(double *variables, ExternalVariable externalVariable);\n",
             &local_f60);
  std::__cxx11::string::~string((string *)&local_f60);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_f40);
  if (!bVar1) {
    testing::Message::Message(local_f68);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_f40);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_61.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/generator/generatorprofile.cpp"
               ,0x1d1,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_61.message_,local_f68);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_61.message_);
    testing::Message::~Message(local_f68);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_f40);
  peVar3 = std::
           __shared_ptr_access<libcellml::GeneratorProfile,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<libcellml::GeneratorProfile,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)&gtest_ar.message_);
  libcellml::GeneratorProfile::implementationInitialiseVariablesMethodString_abi_cxx11_
            (SUB81(&local_fa0,0),SUB81(peVar3,0));
  testing::internal::EqHelper<false>::Compare<char[90],std::__cxx11::string>
            ((EqHelper<false> *)local_f80,
             "\"void initialiseVariables(double *variables, ExternalVariable externalVariable)\\n\" \"{\\n\" \"[CODE]\" \"}\\n\""
             ,"generatorProfile->implementationInitialiseVariablesMethodString(false, true)",
             (char (*) [90])
             "void initialiseVariables(double *variables, ExternalVariable externalVariable)\n{\n[CODE]}\n"
             ,&local_fa0);
  std::__cxx11::string::~string((string *)&local_fa0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_f80);
  if (!bVar1) {
    testing::Message::Message(local_fa8);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_f80);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_62.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/generator/generatorprofile.cpp"
               ,0x1d6,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_62.message_,local_fa8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_62.message_);
    testing::Message::~Message(local_fa8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_f80);
  peVar3 = std::
           __shared_ptr_access<libcellml::GeneratorProfile,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<libcellml::GeneratorProfile,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)&gtest_ar.message_);
  libcellml::GeneratorProfile::interfaceInitialiseVariablesMethodString_abi_cxx11_
            (SUB81(&local_fe0,0),SUB81(peVar3,0));
  testing::internal::EqHelper<false>::Compare<char[77],std::__cxx11::string>
            ((EqHelper<false> *)local_fc0,
             "\"void initialiseVariables(double *states, double *rates, double *variables);\\n\"",
             "generatorProfile->interfaceInitialiseVariablesMethodString(true, false)",
             (char (*) [77])
             "void initialiseVariables(double *states, double *rates, double *variables);\n",
             &local_fe0);
  std::__cxx11::string::~string((string *)&local_fe0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_fc0);
  if (!bVar1) {
    testing::Message::Message(local_fe8);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_fc0);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_63.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/generator/generatorprofile.cpp"
               ,0x1d9,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_63.message_,local_fe8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_63.message_);
    testing::Message::~Message(local_fe8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_fc0);
  peVar3 = std::
           __shared_ptr_access<libcellml::GeneratorProfile,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<libcellml::GeneratorProfile,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)&gtest_ar.message_);
  libcellml::GeneratorProfile::implementationInitialiseVariablesMethodString_abi_cxx11_
            (SUB81(&local_1020,0),SUB81(peVar3,0));
  testing::internal::EqHelper<false>::Compare<char[86],std::__cxx11::string>
            ((EqHelper<false> *)local_1000,
             "\"void initialiseVariables(double *states, double *rates, double *variables)\\n\" \"{\\n\" \"[CODE]\" \"}\\n\""
             ,"generatorProfile->implementationInitialiseVariablesMethodString(true, false)",
             (char (*) [86])
             "void initialiseVariables(double *states, double *rates, double *variables)\n{\n[CODE]}\n"
             ,&local_1020);
  std::__cxx11::string::~string((string *)&local_1020);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1000);
  if (!bVar1) {
    testing::Message::Message(local_1028);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_1000);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_64.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/generator/generatorprofile.cpp"
               ,0x1de,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_64.message_,local_1028);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_64.message_);
    testing::Message::~Message(local_1028);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_1000);
  peVar3 = std::
           __shared_ptr_access<libcellml::GeneratorProfile,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<libcellml::GeneratorProfile,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)&gtest_ar.message_);
  libcellml::GeneratorProfile::interfaceInitialiseVariablesMethodString_abi_cxx11_
            (SUB81(&local_1060,0),SUB81(peVar3,0));
  testing::internal::EqHelper<false>::Compare<char[124],std::__cxx11::string>
            ((EqHelper<false> *)local_1040,
             "\"void initialiseVariables(double voi, double *states, double *rates, double *variables, ExternalVariable externalVariable);\\n\""
             ,"generatorProfile->interfaceInitialiseVariablesMethodString(true, true)",
             (char (*) [124])
             "void initialiseVariables(double voi, double *states, double *rates, double *variables, ExternalVariable externalVariable);\n"
             ,&local_1060);
  std::__cxx11::string::~string((string *)&local_1060);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1040);
  if (!bVar1) {
    testing::Message::Message(local_1068);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_1040);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_65.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/generator/generatorprofile.cpp"
               ,0x1e1,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_65.message_,local_1068);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_65.message_);
    testing::Message::~Message(local_1068);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_1040);
  peVar3 = std::
           __shared_ptr_access<libcellml::GeneratorProfile,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<libcellml::GeneratorProfile,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)&gtest_ar.message_);
  libcellml::GeneratorProfile::implementationInitialiseVariablesMethodString_abi_cxx11_
            (SUB81(&local_10a0,0),SUB81(peVar3,0));
  testing::internal::EqHelper<false>::Compare<char[133],std::__cxx11::string>
            ((EqHelper<false> *)local_1080,
             "\"void initialiseVariables(double voi, double *states, double *rates, double *variables, ExternalVariable externalVariable)\\n\" \"{\\n\" \"[CODE]\" \"}\\n\""
             ,"generatorProfile->implementationInitialiseVariablesMethodString(true, true)",
             (char (*) [133])
             "void initialiseVariables(double voi, double *states, double *rates, double *variables, ExternalVariable externalVariable)\n{\n[CODE]}\n"
             ,&local_10a0);
  std::__cxx11::string::~string((string *)&local_10a0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1080);
  if (!bVar1) {
    testing::Message::Message(local_10a8);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_1080);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_66.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/generator/generatorprofile.cpp"
               ,0x1e6,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_66.message_,local_10a8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_66.message_);
    testing::Message::~Message(local_10a8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_1080);
  std::__shared_ptr_access<libcellml::GeneratorProfile,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
  operator->((__shared_ptr_access<libcellml::GeneratorProfile,_(__gnu_cxx::_Lock_policy)2,_false,_false>
              *)&gtest_ar.message_);
  libcellml::GeneratorProfile::interfaceComputeComputedConstantsMethodString_abi_cxx11_();
  testing::internal::EqHelper<false>::Compare<char[51],std::__cxx11::string>
            ((EqHelper<false> *)local_10c0,
             "\"void computeComputedConstants(double *variables);\\n\"",
             "generatorProfile->interfaceComputeComputedConstantsMethodString()",
             (char (*) [51])"void computeComputedConstants(double *variables);\n",&local_10e0);
  std::__cxx11::string::~string((string *)&local_10e0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_10c0);
  if (!bVar1) {
    testing::Message::Message(local_10e8);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_10c0);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_67.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/generator/generatorprofile.cpp"
               ,0x1e9,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_67.message_,local_10e8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_67.message_);
    testing::Message::~Message(local_10e8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_10c0);
  std::__shared_ptr_access<libcellml::GeneratorProfile,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
  operator->((__shared_ptr_access<libcellml::GeneratorProfile,_(__gnu_cxx::_Lock_policy)2,_false,_false>
              *)&gtest_ar.message_);
  libcellml::GeneratorProfile::implementationComputeComputedConstantsMethodString_abi_cxx11_();
  testing::internal::EqHelper<false>::Compare<char[60],std::__cxx11::string>
            ((EqHelper<false> *)local_1100,
             "\"void computeComputedConstants(double *variables)\\n\" \"{\\n\" \"[CODE]\" \"}\\n\"",
             "generatorProfile->implementationComputeComputedConstantsMethodString()",
             (char (*) [60])"void computeComputedConstants(double *variables)\n{\n[CODE]}\n",
             &local_1120);
  std::__cxx11::string::~string((string *)&local_1120);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1100);
  if (!bVar1) {
    testing::Message::Message(local_1128);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_1100);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_68.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/generator/generatorprofile.cpp"
               ,0x1ee,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_68.message_,local_1128);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_68.message_);
    testing::Message::~Message(local_1128);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_1100);
  std::__shared_ptr_access<libcellml::GeneratorProfile,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
  operator->((__shared_ptr_access<libcellml::GeneratorProfile,_(__gnu_cxx::_Lock_policy)2,_false,_false>
              *)&gtest_ar.message_);
  libcellml::GeneratorProfile::interfaceComputeRatesMethodString_abi_cxx11_(SUB81(&local_1160,0));
  testing::internal::EqHelper<false>::Compare<char[82],std::__cxx11::string>
            ((EqHelper<false> *)local_1140,
             "\"void computeRates(double voi, double *states, double *rates, double *variables);\\n\""
             ,"generatorProfile->interfaceComputeRatesMethodString(false)",
             (char (*) [82])
             "void computeRates(double voi, double *states, double *rates, double *variables);\n",
             &local_1160);
  std::__cxx11::string::~string((string *)&local_1160);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1140);
  if (!bVar1) {
    testing::Message::Message(local_1168);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_1140);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_69.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/generator/generatorprofile.cpp"
               ,0x1f1,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_69.message_,local_1168);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_69.message_);
    testing::Message::~Message(local_1168);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_1140);
  std::__shared_ptr_access<libcellml::GeneratorProfile,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
  operator->((__shared_ptr_access<libcellml::GeneratorProfile,_(__gnu_cxx::_Lock_policy)2,_false,_false>
              *)&gtest_ar.message_);
  libcellml::GeneratorProfile::implementationComputeRatesMethodString_abi_cxx11_
            (SUB81(&local_11a0,0));
  testing::internal::EqHelper<false>::Compare<char[91],std::__cxx11::string>
            ((EqHelper<false> *)local_1180,
             "\"void computeRates(double voi, double *states, double *rates, double *variables)\\n\" \"{\\n\" \"[CODE]\" \"}\\n\""
             ,"generatorProfile->implementationComputeRatesMethodString(false)",
             (char (*) [91])
             "void computeRates(double voi, double *states, double *rates, double *variables)\n{\n[CODE]}\n"
             ,&local_11a0);
  std::__cxx11::string::~string((string *)&local_11a0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1180);
  if (!bVar1) {
    testing::Message::Message(local_11a8);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_1180);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_70.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/generator/generatorprofile.cpp"
               ,0x1f6,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_70.message_,local_11a8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_70.message_);
    testing::Message::~Message(local_11a8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_1180);
  std::__shared_ptr_access<libcellml::GeneratorProfile,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
  operator->((__shared_ptr_access<libcellml::GeneratorProfile,_(__gnu_cxx::_Lock_policy)2,_false,_false>
              *)&gtest_ar.message_);
  libcellml::GeneratorProfile::interfaceComputeRatesMethodString_abi_cxx11_(SUB81(&local_11e0,0));
  testing::internal::EqHelper<false>::Compare<char[117],std::__cxx11::string>
            ((EqHelper<false> *)local_11c0,
             "\"void computeRates(double voi, double *states, double *rates, double *variables, ExternalVariable externalVariable);\\n\""
             ,"generatorProfile->interfaceComputeRatesMethodString(true)",
             (char (*) [117])
             "void computeRates(double voi, double *states, double *rates, double *variables, ExternalVariable externalVariable);\n"
             ,&local_11e0);
  std::__cxx11::string::~string((string *)&local_11e0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_11c0);
  if (!bVar1) {
    testing::Message::Message(local_11e8);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_11c0);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_71.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/generator/generatorprofile.cpp"
               ,0x1f9,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_71.message_,local_11e8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_71.message_);
    testing::Message::~Message(local_11e8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_11c0);
  std::__shared_ptr_access<libcellml::GeneratorProfile,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
  operator->((__shared_ptr_access<libcellml::GeneratorProfile,_(__gnu_cxx::_Lock_policy)2,_false,_false>
              *)&gtest_ar.message_);
  libcellml::GeneratorProfile::implementationComputeRatesMethodString_abi_cxx11_
            (SUB81(&local_1220,0));
  testing::internal::EqHelper<false>::Compare<char[126],std::__cxx11::string>
            ((EqHelper<false> *)local_1200,
             "\"void computeRates(double voi, double *states, double *rates, double *variables, ExternalVariable externalVariable)\\n\" \"{\\n\" \"[CODE]\" \"}\\n\""
             ,"generatorProfile->implementationComputeRatesMethodString(true)",
             (char (*) [126])
             "void computeRates(double voi, double *states, double *rates, double *variables, ExternalVariable externalVariable)\n{\n[CODE]}\n"
             ,&local_1220);
  std::__cxx11::string::~string((string *)&local_1220);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1200);
  if (!bVar1) {
    testing::Message::Message(local_1228);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_1200);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_72.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/generator/generatorprofile.cpp"
               ,0x1fe,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_72.message_,local_1228);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_72.message_);
    testing::Message::~Message(local_1228);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_1200);
  peVar3 = std::
           __shared_ptr_access<libcellml::GeneratorProfile,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<libcellml::GeneratorProfile,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)&gtest_ar.message_);
  libcellml::GeneratorProfile::interfaceComputeVariablesMethodString_abi_cxx11_
            (SUB81(&local_1260,0),SUB81(peVar3,0));
  testing::internal::EqHelper<false>::Compare<char[43],std::__cxx11::string>
            ((EqHelper<false> *)local_1240,"\"void computeVariables(double *variables);\\n\"",
             "generatorProfile->interfaceComputeVariablesMethodString(false, false)",
             (char (*) [43])"void computeVariables(double *variables);\n",&local_1260);
  std::__cxx11::string::~string((string *)&local_1260);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1240);
  if (!bVar1) {
    testing::Message::Message(local_1268);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_1240);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_73.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/generator/generatorprofile.cpp"
               ,0x201,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_73.message_,local_1268);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_73.message_);
    testing::Message::~Message(local_1268);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_1240);
  peVar3 = std::
           __shared_ptr_access<libcellml::GeneratorProfile,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<libcellml::GeneratorProfile,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)&gtest_ar.message_);
  libcellml::GeneratorProfile::implementationComputeVariablesMethodString_abi_cxx11_
            (SUB81(&local_12a0,0),SUB81(peVar3,0));
  testing::internal::EqHelper<false>::Compare<char[52],std::__cxx11::string>
            ((EqHelper<false> *)local_1280,
             "\"void computeVariables(double *variables)\\n\" \"{\\n\" \"[CODE]\" \"}\\n\"",
             "generatorProfile->implementationComputeVariablesMethodString(false, false)",
             (char (*) [52])"void computeVariables(double *variables)\n{\n[CODE]}\n",&local_12a0);
  std::__cxx11::string::~string((string *)&local_12a0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1280);
  if (!bVar1) {
    testing::Message::Message(local_12a8);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_1280);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_74.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/generator/generatorprofile.cpp"
               ,0x206,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_74.message_,local_12a8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_74.message_);
    testing::Message::~Message(local_12a8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_1280);
  peVar3 = std::
           __shared_ptr_access<libcellml::GeneratorProfile,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<libcellml::GeneratorProfile,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)&gtest_ar.message_);
  libcellml::GeneratorProfile::interfaceComputeVariablesMethodString_abi_cxx11_
            (SUB81(&local_12e0,0),SUB81(peVar3,0));
  testing::internal::EqHelper<false>::Compare<char[78],std::__cxx11::string>
            ((EqHelper<false> *)local_12c0,
             "\"void computeVariables(double *variables, ExternalVariable externalVariable);\\n\"",
             "generatorProfile->interfaceComputeVariablesMethodString(false, true)",
             (char (*) [78])
             "void computeVariables(double *variables, ExternalVariable externalVariable);\n",
             &local_12e0);
  std::__cxx11::string::~string((string *)&local_12e0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_12c0);
  if (!bVar1) {
    testing::Message::Message(local_12e8);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_12c0);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_75.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/generator/generatorprofile.cpp"
               ,0x209,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_75.message_,local_12e8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_75.message_);
    testing::Message::~Message(local_12e8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_12c0);
  peVar3 = std::
           __shared_ptr_access<libcellml::GeneratorProfile,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<libcellml::GeneratorProfile,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)&gtest_ar.message_);
  libcellml::GeneratorProfile::implementationComputeVariablesMethodString_abi_cxx11_
            (SUB81(&local_1320,0),SUB81(peVar3,0));
  testing::internal::EqHelper<false>::Compare<char[87],std::__cxx11::string>
            ((EqHelper<false> *)local_1300,
             "\"void computeVariables(double *variables, ExternalVariable externalVariable)\\n\" \"{\\n\" \"[CODE]\" \"}\\n\""
             ,"generatorProfile->implementationComputeVariablesMethodString(false, true)",
             (char (*) [87])
             "void computeVariables(double *variables, ExternalVariable externalVariable)\n{\n[CODE]}\n"
             ,&local_1320);
  std::__cxx11::string::~string((string *)&local_1320);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1300);
  if (!bVar1) {
    testing::Message::Message(local_1328);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_1300);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_76.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/generator/generatorprofile.cpp"
               ,0x20e,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_76.message_,local_1328);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_76.message_);
    testing::Message::~Message(local_1328);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_1300);
  peVar3 = std::
           __shared_ptr_access<libcellml::GeneratorProfile,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<libcellml::GeneratorProfile,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)&gtest_ar.message_);
  libcellml::GeneratorProfile::interfaceComputeVariablesMethodString_abi_cxx11_
            (SUB81(&local_1360,0),SUB81(peVar3,0));
  testing::internal::EqHelper<false>::Compare<char[86],std::__cxx11::string>
            ((EqHelper<false> *)local_1340,
             "\"void computeVariables(double voi, double *states, double *rates, double *variables);\\n\""
             ,"generatorProfile->interfaceComputeVariablesMethodString(true, false)",
             (char (*) [86])
             "void computeVariables(double voi, double *states, double *rates, double *variables);\n"
             ,&local_1360);
  std::__cxx11::string::~string((string *)&local_1360);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1340);
  if (!bVar1) {
    testing::Message::Message(local_1368);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_1340);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_77.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/generator/generatorprofile.cpp"
               ,0x211,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_77.message_,local_1368);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_77.message_);
    testing::Message::~Message(local_1368);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_1340);
  peVar3 = std::
           __shared_ptr_access<libcellml::GeneratorProfile,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<libcellml::GeneratorProfile,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)&gtest_ar.message_);
  libcellml::GeneratorProfile::implementationComputeVariablesMethodString_abi_cxx11_
            (SUB81(&local_13a0,0),SUB81(peVar3,0));
  testing::internal::EqHelper<false>::Compare<char[95],std::__cxx11::string>
            ((EqHelper<false> *)local_1380,
             "\"void computeVariables(double voi, double *states, double *rates, double *variables)\\n\" \"{\\n\" \"[CODE]\" \"}\\n\""
             ,"generatorProfile->implementationComputeVariablesMethodString(true, false)",
             (char (*) [95])
             "void computeVariables(double voi, double *states, double *rates, double *variables)\n{\n[CODE]}\n"
             ,&local_13a0);
  std::__cxx11::string::~string((string *)&local_13a0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1380);
  if (!bVar1) {
    testing::Message::Message(local_13a8);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_1380);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_78.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/generator/generatorprofile.cpp"
               ,0x216,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_78.message_,local_13a8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_78.message_);
    testing::Message::~Message(local_13a8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_1380);
  peVar3 = std::
           __shared_ptr_access<libcellml::GeneratorProfile,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<libcellml::GeneratorProfile,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)&gtest_ar.message_);
  libcellml::GeneratorProfile::interfaceComputeVariablesMethodString_abi_cxx11_
            (SUB81(&local_13e0,0),SUB81(peVar3,0));
  testing::internal::EqHelper<false>::Compare<char[121],std::__cxx11::string>
            ((EqHelper<false> *)local_13c0,
             "\"void computeVariables(double voi, double *states, double *rates, double *variables, ExternalVariable externalVariable);\\n\""
             ,"generatorProfile->interfaceComputeVariablesMethodString(true, true)",
             (char (*) [121])
             "void computeVariables(double voi, double *states, double *rates, double *variables, ExternalVariable externalVariable);\n"
             ,&local_13e0);
  std::__cxx11::string::~string((string *)&local_13e0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_13c0);
  if (!bVar1) {
    testing::Message::Message(local_13e8);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_13c0);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_79.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/generator/generatorprofile.cpp"
               ,0x219,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_79.message_,local_13e8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_79.message_);
    testing::Message::~Message(local_13e8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_13c0);
  peVar3 = std::
           __shared_ptr_access<libcellml::GeneratorProfile,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<libcellml::GeneratorProfile,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)&gtest_ar.message_);
  libcellml::GeneratorProfile::implementationComputeVariablesMethodString_abi_cxx11_
            (SUB81(&local_1420,0),SUB81(peVar3,0));
  testing::internal::EqHelper<false>::Compare<char[130],std::__cxx11::string>
            ((EqHelper<false> *)local_1400,
             "\"void computeVariables(double voi, double *states, double *rates, double *variables, ExternalVariable externalVariable)\\n\" \"{\\n\" \"[CODE]\" \"}\\n\""
             ,"generatorProfile->implementationComputeVariablesMethodString(true, true)",
             (char (*) [130])
             "void computeVariables(double voi, double *states, double *rates, double *variables, ExternalVariable externalVariable)\n{\n[CODE]}\n"
             ,&local_1420);
  std::__cxx11::string::~string((string *)&local_1420);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1400);
  if (!bVar1) {
    testing::Message::Message(local_1428);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_1400);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_80.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/generator/generatorprofile.cpp"
               ,0x21e,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_80.message_,local_1428);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_80.message_);
    testing::Message::~Message(local_1428);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_1400);
  std::__shared_ptr_access<libcellml::GeneratorProfile,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
  operator->((__shared_ptr_access<libcellml::GeneratorProfile,_(__gnu_cxx::_Lock_policy)2,_false,_false>
              *)&gtest_ar.message_);
  libcellml::GeneratorProfile::emptyMethodString_abi_cxx11_();
  testing::internal::EqHelper<false>::Compare<char[1],std::__cxx11::string>
            ((EqHelper<false> *)local_1440,"\"\"","generatorProfile->emptyMethodString()",
             (char (*) [1])0x192cbb,&local_1460);
  std::__cxx11::string::~string((string *)&local_1460);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1440);
  if (!bVar1) {
    testing::Message::Message(local_1468);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_1440);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_81.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/generator/generatorprofile.cpp"
               ,0x220,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_81.message_,local_1468);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_81.message_);
    testing::Message::~Message(local_1468);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_1440);
  std::__shared_ptr_access<libcellml::GeneratorProfile,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
  operator->((__shared_ptr_access<libcellml::GeneratorProfile,_(__gnu_cxx::_Lock_policy)2,_false,_false>
              *)&gtest_ar.message_);
  libcellml::GeneratorProfile::indentString_abi_cxx11_();
  testing::internal::EqHelper<false>::Compare<char[5],std::__cxx11::string>
            ((EqHelper<false> *)local_1480,"\"    \"","generatorProfile->indentString()",
             (char (*) [5])"    ",&local_14a0);
  std::__cxx11::string::~string((string *)&local_14a0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1480);
  if (!bVar1) {
    testing::Message::Message(local_14a8);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_1480);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_82.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/generator/generatorprofile.cpp"
               ,0x222,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_82.message_,local_14a8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_82.message_);
    testing::Message::~Message(local_14a8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_1480);
  std::__shared_ptr_access<libcellml::GeneratorProfile,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
  operator->((__shared_ptr_access<libcellml::GeneratorProfile,_(__gnu_cxx::_Lock_policy)2,_false,_false>
              *)&gtest_ar.message_);
  libcellml::GeneratorProfile::openArrayInitialiserString_abi_cxx11_();
  testing::internal::EqHelper<false>::Compare<char[2],std::__cxx11::string>
            ((EqHelper<false> *)local_14c0,"\"{\"","generatorProfile->openArrayInitialiserString()",
             (char (*) [2])"{",&local_14e0);
  std::__cxx11::string::~string((string *)&local_14e0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_14c0);
  if (!bVar1) {
    testing::Message::Message(local_14e8);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_14c0);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_83.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/generator/generatorprofile.cpp"
               ,0x224,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_83.message_,local_14e8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_83.message_);
    testing::Message::~Message(local_14e8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_14c0);
  std::__shared_ptr_access<libcellml::GeneratorProfile,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
  operator->((__shared_ptr_access<libcellml::GeneratorProfile,_(__gnu_cxx::_Lock_policy)2,_false,_false>
              *)&gtest_ar.message_);
  libcellml::GeneratorProfile::closeArrayInitialiserString_abi_cxx11_();
  testing::internal::EqHelper<false>::Compare<char[2],std::__cxx11::string>
            ((EqHelper<false> *)local_1500,"\"}\"","generatorProfile->closeArrayInitialiserString()"
             ,(char (*) [2])0x193f1c,&local_1520);
  std::__cxx11::string::~string((string *)&local_1520);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1500);
  if (!bVar1) {
    testing::Message::Message(local_1528);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_1500);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_84.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/generator/generatorprofile.cpp"
               ,0x225,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_84.message_,local_1528);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_84.message_);
    testing::Message::~Message(local_1528);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_1500);
  std::__shared_ptr_access<libcellml::GeneratorProfile,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
  operator->((__shared_ptr_access<libcellml::GeneratorProfile,_(__gnu_cxx::_Lock_policy)2,_false,_false>
              *)&gtest_ar.message_);
  libcellml::GeneratorProfile::openArrayString_abi_cxx11_();
  testing::internal::EqHelper<false>::Compare<char[2],std::__cxx11::string>
            ((EqHelper<false> *)local_1540,"\"[\"","generatorProfile->openArrayString()",
             (char (*) [2])"[",&local_1560);
  std::__cxx11::string::~string((string *)&local_1560);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1540);
  if (!bVar1) {
    testing::Message::Message(local_1568);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_1540);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_85.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/generator/generatorprofile.cpp"
               ,0x227,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_85.message_,local_1568);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_85.message_);
    testing::Message::~Message(local_1568);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_1540);
  std::__shared_ptr_access<libcellml::GeneratorProfile,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
  operator->((__shared_ptr_access<libcellml::GeneratorProfile,_(__gnu_cxx::_Lock_policy)2,_false,_false>
              *)&gtest_ar.message_);
  libcellml::GeneratorProfile::closeArrayString_abi_cxx11_();
  testing::internal::EqHelper<false>::Compare<char[2],std::__cxx11::string>
            ((EqHelper<false> *)local_1580,"\"]\"","generatorProfile->closeArrayString()",
             (char (*) [2])0x191e2f,&local_15a0);
  std::__cxx11::string::~string((string *)&local_15a0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1580);
  if (!bVar1) {
    testing::Message::Message(local_15a8);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_1580);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_86.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/generator/generatorprofile.cpp"
               ,0x228,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_86.message_,local_15a8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_86.message_);
    testing::Message::~Message(local_15a8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_1580);
  std::__shared_ptr_access<libcellml::GeneratorProfile,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
  operator->((__shared_ptr_access<libcellml::GeneratorProfile,_(__gnu_cxx::_Lock_policy)2,_false,_false>
              *)&gtest_ar.message_);
  libcellml::GeneratorProfile::arrayElementSeparatorString_abi_cxx11_();
  testing::internal::EqHelper<false>::Compare<char[2],std::__cxx11::string>
            ((EqHelper<false> *)local_15c0,"\",\"","generatorProfile->arrayElementSeparatorString()"
             ,(char (*) [2])",",&local_15e0);
  std::__cxx11::string::~string((string *)&local_15e0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_15c0);
  if (!bVar1) {
    testing::Message::Message(local_15e8);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_15c0);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_87.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/generator/generatorprofile.cpp"
               ,0x22a,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_87.message_,local_15e8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_87.message_);
    testing::Message::~Message(local_15e8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_15c0);
  std::__shared_ptr_access<libcellml::GeneratorProfile,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
  operator->((__shared_ptr_access<libcellml::GeneratorProfile,_(__gnu_cxx::_Lock_policy)2,_false,_false>
              *)&gtest_ar.message_);
  libcellml::GeneratorProfile::stringDelimiterString_abi_cxx11_();
  testing::internal::EqHelper<false>::Compare<char[2],std::__cxx11::string>
            ((EqHelper<false> *)local_1600,"\"\\\"\"","generatorProfile->stringDelimiterString()",
             (char (*) [2])0x196b38,&local_1620);
  std::__cxx11::string::~string((string *)&local_1620);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1600);
  if (!bVar1) {
    testing::Message::Message(local_1628);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_1600);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_88.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/generator/generatorprofile.cpp"
               ,0x22c,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_88.message_,local_1628);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_88.message_);
    testing::Message::~Message(local_1628);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_1600);
  std::__shared_ptr_access<libcellml::GeneratorProfile,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
  operator->((__shared_ptr_access<libcellml::GeneratorProfile,_(__gnu_cxx::_Lock_policy)2,_false,_false>
              *)&gtest_ar.message_);
  libcellml::GeneratorProfile::commandSeparatorString_abi_cxx11_();
  testing::internal::EqHelper<false>::Compare<char[2],std::__cxx11::string>
            ((EqHelper<false> *)local_1640,"\";\"","generatorProfile->commandSeparatorString()",
             (char (*) [2])";",&local_1660);
  std::__cxx11::string::~string((string *)&local_1660);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1640);
  if (!bVar1) {
    testing::Message::Message(local_1668);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_1640);
    testing::internal::AssertHelper::AssertHelper
              (local_1670,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/generator/generatorprofile.cpp"
               ,0x22e,pcVar2);
    testing::internal::AssertHelper::operator=(local_1670,local_1668);
    testing::internal::AssertHelper::~AssertHelper(local_1670);
    testing::Message::~Message(local_1668);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_1640);
  std::shared_ptr<libcellml::GeneratorProfile>::~shared_ptr
            ((shared_ptr<libcellml::GeneratorProfile> *)&gtest_ar.message_);
  return;
}

Assistant:

TEST(GeneratorProfile, defaultMiscellaneousValues)
{
    libcellml::GeneratorProfilePtr generatorProfile = libcellml::GeneratorProfile::create();

    EXPECT_EQ("/* [CODE] */\n", generatorProfile->commentString());
    EXPECT_EQ("The content of this file was generated using [PROFILE_INFORMATION] libCellML [LIBCELLML_VERSION].", generatorProfile->originCommentString());

    EXPECT_EQ("model.h", generatorProfile->interfaceFileNameString());

    EXPECT_EQ("#pragma once\n"
              "\n"
              "#include <stddef.h>\n",
              generatorProfile->interfaceHeaderString());
    EXPECT_EQ("#include \"[INTERFACE_FILE_NAME]\"\n"
              "\n"
              "#include <math.h>\n"
              "#include <stdlib.h>\n",
              generatorProfile->implementationHeaderString());

    EXPECT_EQ("extern const char VERSION[];\n", generatorProfile->interfaceVersionString());
    EXPECT_EQ("const char VERSION[] = \"0.5.0\";\n", generatorProfile->implementationVersionString());

    EXPECT_EQ("extern const char LIBCELLML_VERSION[];\n", generatorProfile->interfaceLibcellmlVersionString());
    EXPECT_EQ("const char LIBCELLML_VERSION[] = \"[LIBCELLML_VERSION]\";\n", generatorProfile->implementationLibcellmlVersionString());

    EXPECT_EQ("extern const size_t STATE_COUNT;\n", generatorProfile->interfaceStateCountString());
    EXPECT_EQ("const size_t STATE_COUNT = [STATE_COUNT];\n", generatorProfile->implementationStateCountString());

    EXPECT_EQ("extern const size_t VARIABLE_COUNT;\n", generatorProfile->interfaceVariableCountString());
    EXPECT_EQ("const size_t VARIABLE_COUNT = [VARIABLE_COUNT];\n", generatorProfile->implementationVariableCountString());

    EXPECT_EQ("typedef enum {\n"
              "    CONSTANT,\n"
              "    COMPUTED_CONSTANT,\n"
              "    ALGEBRAIC\n"
              "} VariableType;\n",
              generatorProfile->variableTypeObjectString(false, false));
    EXPECT_EQ("typedef enum {\n"
              "    CONSTANT,\n"
              "    COMPUTED_CONSTANT,\n"
              "    ALGEBRAIC,\n"
              "    EXTERNAL\n"
              "} VariableType;\n",
              generatorProfile->variableTypeObjectString(false, true));
    EXPECT_EQ("typedef enum {\n"
              "    VARIABLE_OF_INTEGRATION,\n"
              "    STATE,\n"
              "    CONSTANT,\n"
              "    COMPUTED_CONSTANT,\n"
              "    ALGEBRAIC\n"
              "} VariableType;\n",
              generatorProfile->variableTypeObjectString(true, false));
    EXPECT_EQ("typedef enum {\n"
              "    VARIABLE_OF_INTEGRATION,\n"
              "    STATE,\n"
              "    CONSTANT,\n"
              "    COMPUTED_CONSTANT,\n"
              "    ALGEBRAIC,\n"
              "    EXTERNAL\n"
              "} VariableType;\n",
              generatorProfile->variableTypeObjectString(true, true));

    EXPECT_EQ("VARIABLE_OF_INTEGRATION", generatorProfile->variableOfIntegrationVariableTypeString());
    EXPECT_EQ("STATE", generatorProfile->stateVariableTypeString());
    EXPECT_EQ("CONSTANT", generatorProfile->constantVariableTypeString());
    EXPECT_EQ("COMPUTED_CONSTANT", generatorProfile->computedConstantVariableTypeString());
    EXPECT_EQ("ALGEBRAIC", generatorProfile->algebraicVariableTypeString());
    EXPECT_EQ("EXTERNAL", generatorProfile->externalVariableTypeString());

    EXPECT_EQ("typedef struct {\n"
              "    char name[[NAME_SIZE]];\n"
              "    char units[[UNITS_SIZE]];\n"
              "    char component[[COMPONENT_SIZE]];\n"
              "    VariableType type;\n"
              "} VariableInfo;\n",
              generatorProfile->variableInfoObjectString());

    EXPECT_EQ("extern const VariableInfo VOI_INFO;\n", generatorProfile->interfaceVoiInfoString());
    EXPECT_EQ("const VariableInfo VOI_INFO = [CODE];\n", generatorProfile->implementationVoiInfoString());

    EXPECT_EQ("extern const VariableInfo STATE_INFO[];\n", generatorProfile->interfaceStateInfoString());
    EXPECT_EQ("const VariableInfo STATE_INFO[] = {\n"
              "[CODE]"
              "};\n",
              generatorProfile->implementationStateInfoString());

    EXPECT_EQ("extern const VariableInfo VARIABLE_INFO[];\n", generatorProfile->interfaceVariableInfoString());
    EXPECT_EQ("const VariableInfo VARIABLE_INFO[] = {\n"
              "[CODE]"
              "};\n",
              generatorProfile->implementationVariableInfoString());

    EXPECT_EQ("{\"[NAME]\", \"[UNITS]\", \"[COMPONENT]\", [TYPE]}", generatorProfile->variableInfoEntryString());

    EXPECT_EQ("voi", generatorProfile->voiString());

    EXPECT_EQ("states", generatorProfile->statesArrayString());
    EXPECT_EQ("rates", generatorProfile->ratesArrayString());
    EXPECT_EQ("variables", generatorProfile->variablesArrayString());

    EXPECT_EQ("typedef double (* ExternalVariable)(double *variables, size_t index);\n", generatorProfile->externalVariableMethodTypeDefinitionString(false));
    EXPECT_EQ("typedef double (* ExternalVariable)(double voi, double *states, double *rates, double *variables, size_t index);\n", generatorProfile->externalVariableMethodTypeDefinitionString(true));

    EXPECT_EQ("externalVariable(variables, [INDEX])", generatorProfile->externalVariableMethodCallString(false));
    EXPECT_EQ("externalVariable(voi, states, rates, variables, [INDEX])", generatorProfile->externalVariableMethodCallString(true));

    EXPECT_EQ("double * createStatesArray();\n",
              generatorProfile->interfaceCreateStatesArrayMethodString());
    EXPECT_EQ("double * createStatesArray()\n"
              "{\n"
              "    double *res = (double *) malloc(STATE_COUNT*sizeof(double));\n"
              "\n"
              "    for (size_t i = 0; i < STATE_COUNT; ++i) {\n"
              "        res[i] = NAN;\n"
              "    }\n"
              "\n"
              "    return res;\n"
              "}\n",
              generatorProfile->implementationCreateStatesArrayMethodString());

    EXPECT_EQ("typedef struct {\n"
              "    double *variables;\n"
              "} RootFindingInfo;\n",
              generatorProfile->rootFindingInfoObjectString(false));
    EXPECT_EQ("typedef struct {\n"
              "    double voi;\n"
              "    double *states;\n"
              "    double *rates;\n"
              "    double *variables;\n"
              "} RootFindingInfo;\n",
              generatorProfile->rootFindingInfoObjectString(true));
    EXPECT_EQ("extern void nlaSolve(void (*objectiveFunction)(double *, double *, void *),\n"
              "                     double *u, size_t n, void *data);\n",
              generatorProfile->externNlaSolveMethodString());
    EXPECT_EQ("findRoot[INDEX](variables);\n",
              generatorProfile->findRootCallString(false));
    EXPECT_EQ("findRoot[INDEX](voi, states, rates, variables);\n",
              generatorProfile->findRootCallString(true));
    EXPECT_EQ("void findRoot[INDEX](double *variables)\n"
              "{\n"
              "    RootFindingInfo rfi = { variables };\n"
              "    double u[[SIZE]];\n"
              "\n"
              "[CODE]"
              "}\n",
              generatorProfile->findRootMethodString(false));
    EXPECT_EQ("void findRoot[INDEX](double voi, double *states, double *rates, double *variables)\n"
              "{\n"
              "    RootFindingInfo rfi = { voi, states, rates, variables };\n"
              "    double u[[SIZE]];\n"
              "\n"
              "[CODE]"
              "}\n",
              generatorProfile->findRootMethodString(true));
    EXPECT_EQ("nlaSolve(objectiveFunction[INDEX], u, [SIZE], &rfi);\n",
              generatorProfile->nlaSolveCallString(false));
    EXPECT_EQ("nlaSolve(objectiveFunction[INDEX], u, [SIZE], &rfi);\n",
              generatorProfile->nlaSolveCallString(true));
    EXPECT_EQ("void objectiveFunction[INDEX](double *u, double *f, void *data)\n"
              "{\n"
              "    double *variables = ((RootFindingInfo *) data)->variables;\n"
              "\n"
              "[CODE]"
              "}\n",
              generatorProfile->objectiveFunctionMethodString(false));
    EXPECT_EQ("void objectiveFunction[INDEX](double *u, double *f, void *data)\n"
              "{\n"
              "    double voi = ((RootFindingInfo *) data)->voi;\n"
              "    double *states = ((RootFindingInfo *) data)->states;\n"
              "    double *rates = ((RootFindingInfo *) data)->rates;\n"
              "    double *variables = ((RootFindingInfo *) data)->variables;\n"
              "\n"
              "[CODE]"
              "}\n",
              generatorProfile->objectiveFunctionMethodString(true));
    EXPECT_EQ("u",
              generatorProfile->uArrayString());
    EXPECT_EQ("f",
              generatorProfile->fArrayString());

    EXPECT_EQ("double * createVariablesArray();\n",
              generatorProfile->interfaceCreateVariablesArrayMethodString());
    EXPECT_EQ("double * createVariablesArray()\n"
              "{\n"
              "    double *res = (double *) malloc(VARIABLE_COUNT*sizeof(double));\n"
              "\n"
              "    for (size_t i = 0; i < VARIABLE_COUNT; ++i) {\n"
              "        res[i] = NAN;\n"
              "    }\n"
              "\n"
              "    return res;\n"
              "}\n",
              generatorProfile->implementationCreateVariablesArrayMethodString());

    EXPECT_EQ("void deleteArray(double *array);\n",
              generatorProfile->interfaceDeleteArrayMethodString());
    EXPECT_EQ("void deleteArray(double *array)\n"
              "{\n"
              "    free(array);\n"
              "}\n",
              generatorProfile->implementationDeleteArrayMethodString());

    EXPECT_EQ("void initialiseVariables(double *variables);\n",
              generatorProfile->interfaceInitialiseVariablesMethodString(false, false));
    EXPECT_EQ("void initialiseVariables(double *variables)\n"
              "{\n"
              "[CODE]"
              "}\n",
              generatorProfile->implementationInitialiseVariablesMethodString(false, false));

    EXPECT_EQ("void initialiseVariables(double *variables, ExternalVariable externalVariable);\n",
              generatorProfile->interfaceInitialiseVariablesMethodString(false, true));
    EXPECT_EQ("void initialiseVariables(double *variables, ExternalVariable externalVariable)\n"
              "{\n"
              "[CODE]"
              "}\n",
              generatorProfile->implementationInitialiseVariablesMethodString(false, true));

    EXPECT_EQ("void initialiseVariables(double *states, double *rates, double *variables);\n",
              generatorProfile->interfaceInitialiseVariablesMethodString(true, false));
    EXPECT_EQ("void initialiseVariables(double *states, double *rates, double *variables)\n"
              "{\n"
              "[CODE]"
              "}\n",
              generatorProfile->implementationInitialiseVariablesMethodString(true, false));

    EXPECT_EQ("void initialiseVariables(double voi, double *states, double *rates, double *variables, ExternalVariable externalVariable);\n",
              generatorProfile->interfaceInitialiseVariablesMethodString(true, true));
    EXPECT_EQ("void initialiseVariables(double voi, double *states, double *rates, double *variables, ExternalVariable externalVariable)\n"
              "{\n"
              "[CODE]"
              "}\n",
              generatorProfile->implementationInitialiseVariablesMethodString(true, true));

    EXPECT_EQ("void computeComputedConstants(double *variables);\n",
              generatorProfile->interfaceComputeComputedConstantsMethodString());
    EXPECT_EQ("void computeComputedConstants(double *variables)\n"
              "{\n"
              "[CODE]"
              "}\n",
              generatorProfile->implementationComputeComputedConstantsMethodString());

    EXPECT_EQ("void computeRates(double voi, double *states, double *rates, double *variables);\n",
              generatorProfile->interfaceComputeRatesMethodString(false));
    EXPECT_EQ("void computeRates(double voi, double *states, double *rates, double *variables)\n"
              "{\n"
              "[CODE]"
              "}\n",
              generatorProfile->implementationComputeRatesMethodString(false));

    EXPECT_EQ("void computeRates(double voi, double *states, double *rates, double *variables, ExternalVariable externalVariable);\n",
              generatorProfile->interfaceComputeRatesMethodString(true));
    EXPECT_EQ("void computeRates(double voi, double *states, double *rates, double *variables, ExternalVariable externalVariable)\n"
              "{\n"
              "[CODE]"
              "}\n",
              generatorProfile->implementationComputeRatesMethodString(true));

    EXPECT_EQ("void computeVariables(double *variables);\n",
              generatorProfile->interfaceComputeVariablesMethodString(false, false));
    EXPECT_EQ("void computeVariables(double *variables)\n"
              "{\n"
              "[CODE]"
              "}\n",
              generatorProfile->implementationComputeVariablesMethodString(false, false));

    EXPECT_EQ("void computeVariables(double *variables, ExternalVariable externalVariable);\n",
              generatorProfile->interfaceComputeVariablesMethodString(false, true));
    EXPECT_EQ("void computeVariables(double *variables, ExternalVariable externalVariable)\n"
              "{\n"
              "[CODE]"
              "}\n",
              generatorProfile->implementationComputeVariablesMethodString(false, true));

    EXPECT_EQ("void computeVariables(double voi, double *states, double *rates, double *variables);\n",
              generatorProfile->interfaceComputeVariablesMethodString(true, false));
    EXPECT_EQ("void computeVariables(double voi, double *states, double *rates, double *variables)\n"
              "{\n"
              "[CODE]"
              "}\n",
              generatorProfile->implementationComputeVariablesMethodString(true, false));

    EXPECT_EQ("void computeVariables(double voi, double *states, double *rates, double *variables, ExternalVariable externalVariable);\n",
              generatorProfile->interfaceComputeVariablesMethodString(true, true));
    EXPECT_EQ("void computeVariables(double voi, double *states, double *rates, double *variables, ExternalVariable externalVariable)\n"
              "{\n"
              "[CODE]"
              "}\n",
              generatorProfile->implementationComputeVariablesMethodString(true, true));

    EXPECT_EQ("", generatorProfile->emptyMethodString());

    EXPECT_EQ("    ", generatorProfile->indentString());

    EXPECT_EQ("{", generatorProfile->openArrayInitialiserString());
    EXPECT_EQ("}", generatorProfile->closeArrayInitialiserString());

    EXPECT_EQ("[", generatorProfile->openArrayString());
    EXPECT_EQ("]", generatorProfile->closeArrayString());

    EXPECT_EQ(",", generatorProfile->arrayElementSeparatorString());

    EXPECT_EQ("\"", generatorProfile->stringDelimiterString());

    EXPECT_EQ(";", generatorProfile->commandSeparatorString());
}